

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Shader *shader,
               string *warn,string *err,PrimReconstructOptions *options)

{
  pointer pcVar1;
  Shader *pSVar2;
  ostringstream oVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  ostream *poVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  ReferenceList *references_00;
  ReferenceList *references_01;
  ReferenceList *references_02;
  ReferenceList *references_03;
  ReferenceList *references_04;
  ReferenceList *references_05;
  ReferenceList *references_06;
  ReferenceList *references_07;
  ReferenceList *references_08;
  char **ppcVar11;
  UsdPreviewSurface *spec_00;
  UsdUVTexture *spec_01;
  UsdPrimvarReader<std::array<float,_4UL>_> *spec_02;
  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *spec_03;
  UsdPrimvarReader<tinyusdz::value::vector3f> *spec_04;
  UsdPrimvarReader<tinyusdz::value::normal3f> *spec_05;
  UsdPrimvarReader<tinyusdz::value::point3f> *spec_06;
  UsdTransform2d *pUVar12;
  string shader_type;
  optional<tinyusdz::Token> pv;
  ostringstream ss_e;
  PrimReconstructOptions *in_stack_ffffffffffffce98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3158;
  Shader *local_3138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3130;
  char *local_3110;
  long local_3108;
  char local_3100;
  undefined7 uStack_30ff;
  string *local_30f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30e8 [3];
  ios_base local_3078 [264];
  undefined1 local_2f70 [152];
  bool local_2ed8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2ed0;
  bool local_2ea0;
  storage_t<tinyusdz::value::StringData> local_2e98;
  bool local_2e68;
  storage_t<tinyusdz::value::StringData> local_2e60;
  bool local_2e30;
  storage_t<tinyusdz::APISchemas> local_2e28;
  bool local_2e08;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2e00;
  optional<bool> local_2dd0;
  bool local_2dc8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2dc0;
  bool local_2d90;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
  local_2d88;
  bool local_2d68;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
  local_2d60;
  bool local_2d40;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_2d38;
  bool local_2d18;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2d10;
  bool local_2cf0;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2ce8;
  bool local_2cb8;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_2cb0;
  bool local_2c90;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c88;
  bool local_2c68;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c60;
  _Rb_tree_node_base local_2c38;
  size_t local_2c18;
  _Rb_tree_node_base local_2c08;
  size_t local_2be8;
  pointer pTStack_2be0;
  pointer local_2bd8;
  pointer pTStack_2bd0;
  pointer pTStack_2bc8;
  undefined1 uStack_2bc0;
  undefined7 local_2bbf;
  undefined1 uStack_2bb8;
  undefined8 uStack_2bb7;
  storage_t<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  local_2ba8;
  bool local_2b88;
  undefined1 auStack_2b80 [32];
  undefined1 auStack_2b60 [28];
  storage_t<tinyusdz::Interpolation> local_2b44;
  bool local_2b40;
  storage_t<unsigned_int> local_2b3c;
  optional<bool> local_2b38;
  bool local_2b30;
  storage_t<tinyusdz::value::StringData> local_2b28;
  bool local_2af8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2af0;
  bool local_2ac0;
  storage_t<double> local_2ab8;
  bool local_2ab0;
  storage_t<tinyusdz::Token> local_2aa8;
  bool local_2a88;
  storage_t<tinyusdz::Token> local_2a80;
  bool local_2a60;
  storage_t<tinyusdz::Token> local_2a58;
  bool local_2a38;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2a30;
  bool local_2a00;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29f8;
  bool local_29d8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29d0;
  bool local_29b0;
  storage_t<tinyusdz::Token> local_29a8;
  _Rb_tree_node_base local_2980;
  size_t local_2960;
  pointer pSStack_2958;
  pointer local_2950;
  pointer pSStack_2948;
  pointer pPStack_2940;
  undefined1 uStack_2938;
  undefined7 local_2937;
  undefined1 uStack_2930;
  undefined8 uStack_292f;
  storage_t<tinyusdz::Purpose> local_2924;
  bool local_2920;
  Purpose local_291c;
  bool local_2918;
  ListEditQual local_2910;
  pointer pRStack_2908;
  undefined4 uStack_2900;
  undefined4 local_28fc;
  undefined4 uStack_28f8;
  undefined8 uStack_28f4;
  pointer local_28e8;
  pointer pPStack_28e0;
  pointer local_28d8;
  _Rb_tree_node_base local_28c8;
  size_t local_28a8;
  _Rb_tree_node_base local_2898;
  size_t local_2878;
  pointer pTStack_2870;
  pointer local_2868;
  pointer pTStack_2860;
  pointer pTStack_2858;
  undefined1 uStack_2850;
  undefined7 local_284f;
  undefined1 uStack_2848;
  undefined8 uStack_2847;
  storage_t<tinyusdz::Interpolation> local_283c;
  bool local_2838;
  storage_t<unsigned_int> local_2834;
  optional<bool> local_2830;
  bool local_2828;
  storage_t<tinyusdz::value::StringData> local_2820;
  bool local_27f0;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_27e8;
  bool local_27b8;
  storage_t<double> local_27b0;
  bool local_27a8;
  storage_t<tinyusdz::Token> local_27a0;
  bool local_2780;
  storage_t<tinyusdz::Token> local_2778;
  bool local_2758;
  storage_t<tinyusdz::Token> local_2750;
  bool local_2730;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_2728;
  bool local_26f8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_26f0;
  bool local_26d0;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_26c8;
  bool local_26a8;
  storage_t<tinyusdz::Token> local_26a0;
  _Rb_tree_node_base local_2678;
  size_t local_2658;
  pointer pSStack_2650;
  pointer local_2648;
  pointer pSStack_2640;
  bool local_2638;
  pointer pPStack_2630;
  undefined1 uStack_2628;
  undefined7 local_2627;
  bool bStack_2620;
  undefined8 uStack_261f;
  undefined1 local_2610 [88];
  undefined1 auStack_25b8 [24];
  undefined1 auStack_25a0 [32];
  undefined1 auStack_2580 [24];
  undefined1 auStack_2568 [32];
  undefined1 local_2548 [16];
  undefined1 auStack_2538 [24];
  undefined1 auStack_2520 [16];
  undefined1 auStack_2510 [16];
  undefined1 auStack_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 auStack_24e0 [16];
  undefined1 auStack_24d0 [16];
  undefined1 auStack_24c0 [16];
  undefined1 auStack_24b0 [32];
  undefined1 local_2490 [16];
  undefined1 auStack_2480 [24];
  undefined1 local_2468 [16];
  undefined1 auStack_2458 [16];
  undefined1 auStack_2448 [16];
  undefined1 auStack_2438 [16];
  undefined1 auStack_2428 [16];
  undefined1 local_2418 [8];
  undefined1 local_2410 [8];
  undefined1 local_2408 [40];
  pointer pSStack_23e0;
  pointer pSStack_23d8;
  pointer local_23d0;
  bool bStack_23c8;
  undefined7 uStack_23c7;
  undefined1 uStack_23c0;
  undefined7 local_23bf;
  bool bStack_23b8;
  undefined7 uStack_23b7;
  undefined1 auStack_23b0 [16];
  undefined1 auStack_23a0 [32];
  undefined1 auStack_2380 [56];
  optional<bool> local_2348;
  undefined1 local_2340 [16];
  undefined1 auStack_2330 [40];
  undefined1 local_2308 [16];
  undefined1 auStack_22f8 [16];
  undefined1 auStack_22e8 [40];
  undefined1 local_22c0 [16];
  undefined1 auStack_22b0 [24];
  undefined1 local_2298 [16];
  undefined1 auStack_2288 [16];
  undefined1 auStack_2278 [16];
  undefined1 auStack_2268 [16];
  undefined1 auStack_2258 [16];
  undefined1 local_2248 [16];
  undefined1 auStack_2238 [16];
  undefined1 auStack_2228 [16];
  undefined1 auStack_2218 [16];
  undefined1 auStack_2208 [16];
  undefined1 auStack_21f8 [16];
  undefined1 local_21e8 [16];
  undefined1 auStack_21d8 [16];
  undefined1 auStack_21c8 [16];
  undefined1 auStack_21b8 [16];
  undefined1 auStack_21a8 [16];
  undefined1 local_2198 [24];
  undefined1 local_2180 [24];
  storage_t<tinyusdz::Token> sStack_2168;
  _Alloc_hider local_2148;
  undefined1 local_2140 [8];
  _Rb_tree_node_base local_2138 [264];
  
  pcVar1 = local_2f70 + 0x10;
  local_3138 = shader;
  local_2f70._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f70,"info:id","");
  cVar6 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&properties->_M_t,(key_type *)local_2f70);
  if ((pointer)local_2f70._0_8_ != pcVar1) {
    operator_delete((void *)local_2f70._0_8_,local_2f70._16_8_ + 1);
  }
  local_3110 = &local_3100;
  local_3108 = 0;
  local_3100 = '\0';
  if ((_Rb_tree_header *)cVar6._M_node != &(properties->_M_t)._M_impl.super__Rb_tree_header) {
    if (*(uint *)((long)&cVar6._M_node[0x17]._M_parent + 4) < 2) {
      local_30f0 = warn;
      Attribute::type_name_abi_cxx11_((string *)local_2f70,(Attribute *)(cVar6._M_node + 2));
      iVar5 = ::std::__cxx11::string::compare((char *)local_2f70);
      if ((pointer)local_2f70._0_8_ != pcVar1) {
        operator_delete((void *)local_2f70._0_8_,local_2f70._16_8_ + 1);
      }
      if (iVar5 == 0) {
        Attribute::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)local_2f70,(Attribute *)(cVar6._M_node + 2));
        warn = local_30f0;
        oVar3 = local_2f70[0];
        local_30e8[0]._M_dataplus._M_p._0_1_ = local_2f70[0];
        if (local_2f70[0] == (ostringstream)0x1) {
          local_30e8[0]._M_string_length = (long)&local_30e8[0].field_2 + 8;
          if (local_2f70._8_8_ != (long)local_2f70 + 0x18) {
            local_30e8[0]._M_string_length = local_2f70._8_8_;
          }
          local_30e8[0].field_2._9_7_ = local_2f70._25_7_;
          local_30e8[0].field_2._M_local_buf[8] = local_2f70[0x18];
          local_30e8[0].field_2._M_allocated_capacity = local_2f70._16_8_;
          local_2f70._16_8_ = 0;
          local_2f70[0x18] = '\0';
          local_2f70._8_8_ = (long)local_2f70 + 0x18;
        }
        if (local_2f70[0] == (ostringstream)0x1) {
          ::std::__cxx11::string::_M_assign((string *)&local_3110);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f70);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f70,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f70,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f70,0x1271);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f70,"Internal errror. `info:id` has invalid type.",0x2c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar8 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_3130,(ulong)(err->_M_dataplus)._M_p);
            psVar10 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_3158.field_2._M_allocated_capacity = *psVar10;
              local_3158.field_2._8_8_ = plVar8[3];
              local_3158._M_dataplus._M_p = (pointer)&local_3158.field_2;
            }
            else {
              local_3158.field_2._M_allocated_capacity = *psVar10;
              local_3158._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_3158._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
              operator_delete(local_3158._M_dataplus._M_p,
                              local_3158.field_2._M_allocated_capacity + 1);
            }
            warn = local_30f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
              operator_delete(local_3130._M_dataplus._M_p,
                              local_3130.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f70);
          ::std::ios_base::~ios_base((ios_base *)(local_2f70 + 0x70));
        }
        if ((local_30e8[0]._M_dataplus._M_p._0_1_ == (ostringstream)0x1) &&
           (local_30e8[0]._M_string_length != (long)&local_30e8[0].field_2 + 8)) {
          operator_delete((void *)local_30e8[0]._M_string_length,local_30e8[0].field_2._8_8_ + 1);
        }
        if (oVar3 != (ostringstream)0x0) {
          if (cVar6._M_node[3]._M_color != _S_black) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f70);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f70,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f70,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f70,0x1279);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f70,"`info:id` attribute must have `uniform` variability.",
                       0x34);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"\n",1);
            if (warn != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              warn = local_30f0;
              ::std::operator+(local_30e8,&local_3158,err);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_30e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_30e8[0]._M_dataplus._M_p != &local_30e8[0].field_2) {
                operator_delete(local_30e8[0]._M_dataplus._M_p,
                                local_30e8[0].field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                operator_delete(local_3158._M_dataplus._M_p,
                                local_3158.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f70);
            ::std::ios_base::~ios_base((ios_base *)(local_2f70 + 0x70));
          }
          goto LAB_002455c6;
        }
        goto LAB_002451a5;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f70);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f70,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f70,"ReconstructPrim",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f70,0x1274);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f70,"`info:id` attribute must be `token` type.",0x29);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"\n",1);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f70);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f70,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f70,"ReconstructPrim",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f70,0x127c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2f70,"Invalid type or value for `info:id` property in `Shader`.",
                 0x39);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f70,"\n",1);
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      plVar8 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)&local_3158,(ulong)(err->_M_dataplus)._M_p);
      puVar9 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_30e8[0].field_2._0_8_ = *puVar9;
        local_30e8[0].field_2._8_8_ = plVar8[3];
        local_30e8[0]._M_dataplus._M_p = (pointer)&local_30e8[0].field_2;
      }
      else {
        local_30e8[0].field_2._0_8_ = *puVar9;
        local_30e8[0]._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_30e8[0]._M_string_length = *(size_type *)(plVar8 + 1);
      *plVar8 = (long)puVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)err,(string *)local_30e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30e8[0]._M_dataplus._M_p != &local_30e8[0].field_2) {
        operator_delete(local_30e8[0]._M_dataplus._M_p,
                        local_30e8[0].field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
        operator_delete(local_3158._M_dataplus._M_p,local_3158.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f70);
    ::std::ios_base::~ios_base((ios_base *)(local_2f70 + 0x70));
    goto LAB_002451a5;
  }
LAB_002455c6:
  iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
  if (iVar5 == 0) {
    spec_00 = (UsdPreviewSurface *)local_2f70;
    UsdPreviewSurface::UsdPreviewSurface((UsdPreviewSurface *)local_2f70);
    bVar4 = ReconstructShader<tinyusdz::UsdPreviewSurface>
                      ((Specifier *)spec_00,properties,references_01,(UsdPreviewSurface *)local_2f70
                       ,warn,err,in_stack_ffffffffffffce98);
    pSVar2 = local_3138;
    if (bVar4) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_3138->info_id,0,(char *)(local_3138->info_id)._M_string_length,
                 0x3bc9ec);
      linb::any::operator=(&(pSVar2->value).v_,(UsdPreviewSurface *)local_2f70);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,"ReconstructPrim",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x1287);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,"UsdPreviewSurface",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        plVar8 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)&local_3130,(ulong)(err->_M_dataplus)._M_p);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_3158.field_2._M_allocated_capacity = *psVar10;
          local_3158.field_2._8_8_ = plVar8[3];
          local_3158._M_dataplus._M_p = (pointer)&local_3158.field_2;
        }
        else {
          local_3158.field_2._M_allocated_capacity = *psVar10;
          local_3158._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_3158._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
          operator_delete(local_3158._M_dataplus._M_p,local_3158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
          operator_delete(local_3130._M_dataplus._M_p,local_3130.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
      ::std::ios_base::~ios_base(local_3078);
    }
    UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)local_2f70);
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
    if (iVar5 != 0) {
      ppcVar11 = &local_3110;
      iVar5 = ::std::__cxx11::string::compare((char *)ppcVar11);
      if (iVar5 == 0) {
        local_2f70._64_8_ = local_2f70 + 0x50;
        local_2f70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2f70._16_8_ = local_2f70._16_8_ & 0xffffffffffffff00;
        local_2f70._32_4_ = 0;
        local_2f70._40_8_ = -1;
        local_2f70._56_4_ = (storage_t<tinyusdz::Kind>)0x0;
        local_2f70[0x30] = false;
        local_2f70[0x31] = (storage_t<bool>)0x0;
        local_2f70[0x32] = false;
        local_2f70[0x33] = (storage_t<bool>)0x0;
        local_2f70[0x34] = false;
        local_2f70._72_8_ = 0;
        local_2f70[0x50] = '\0';
        local_2f70[0x60] = false;
        local_2dc8 = false;
        local_2c60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2c60._8_8_ = 0;
        local_2c60._16_8_ = 0;
        local_2c60._24_8_ = 0;
        local_2c38._M_left = &local_2c38;
        local_2c38._M_color = _S_red;
        local_2c38._M_parent = (_Base_ptr)0x0;
        local_2f70._104_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2f70._112_8_ = 0;
        local_2f70._120_8_ = 0;
        local_2f70._128_8_ = 0;
        local_2f70._136_8_ = 0;
        local_2f70._144_8_ = 0;
        local_2ed8 = false;
        local_2ea0 = false;
        local_2ed0._32_8_ = 0;
        local_2ed0._40_8_ = 0;
        local_2ed0._16_8_ = 0;
        local_2ed0._24_8_ = 0;
        local_2ed0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2ed0._8_8_ = 0;
        local_2e98.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e98._8_8_ = 0;
        local_2e98._16_8_ = 0;
        local_2e98._24_8_ = 0;
        local_2e98._32_8_ = 0;
        local_2e98._40_8_ = 0;
        local_2e68 = false;
        local_2e60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e60._8_8_ = 0;
        local_2e60._16_8_ = 0;
        local_2e60._24_8_ = 0;
        local_2e60._32_8_ = 0;
        local_2e60._40_8_ = 0;
        local_2e30 = false;
        local_2e28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e28._8_8_ = 0;
        local_2e28._16_8_ = 0;
        local_2e28._24_8_ = 0;
        local_2e08 = false;
        local_2e00.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e00._8_8_ = 0;
        local_2e00._16_8_ = 0;
        local_2e00._24_8_ = 0;
        local_2e00._32_8_ = 0;
        local_2e00._40_8_ = 0;
        local_2dd0.has_value_ = false;
        local_2dd0.contained = (storage_t<bool>)0x0;
        local_2d90 = false;
        local_2dc0._32_8_ = 0;
        local_2dc0._40_8_ = 0;
        local_2dc0._16_8_ = 0;
        local_2dc0._24_8_ = 0;
        local_2dc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2dc0._8_8_ = 0;
        local_2d68 = false;
        local_2d88._16_8_ = 0;
        local_2d88._24_8_ = 0;
        local_2d88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d88._8_8_ = 0;
        local_2d40 = false;
        local_2d60._16_8_ = 0;
        local_2d60._24_8_ = 0;
        local_2d60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d60._8_8_ = 0;
        local_2d18 = false;
        local_2d38._16_8_ = 0;
        local_2d38._24_8_ = 0;
        local_2d38.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d38._8_8_ = 0;
        local_2cf0 = false;
        local_2d10._16_8_ = 0;
        local_2d10._24_8_ = 0;
        local_2d10.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d10._8_8_ = 0;
        local_2cb8 = false;
        local_2ce8._32_8_ = 0;
        local_2ce8._40_8_ = 0;
        local_2ce8._16_8_ = 0;
        local_2ce8._24_8_ = 0;
        local_2ce8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2ce8._8_8_ = 0;
        local_2c90 = false;
        local_2cb0._16_8_ = 0;
        local_2cb0._24_8_ = 0;
        local_2cb0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2cb0._8_8_ = 0;
        local_2c68 = false;
        local_2c88._16_8_ = 0;
        local_2c88._24_8_ = 0;
        local_2c88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2c88._8_8_ = 0;
        local_2c18 = 0;
        local_2c08._M_left = &local_2c08;
        local_2c08._M_color = _S_red;
        local_2c08._M_parent = (_Base_ptr)0x0;
        uStack_2bb8 = 0;
        uStack_2bb7 = 0;
        pTStack_2bc8 = (pointer)0x0;
        uStack_2bc0 = 0;
        local_2bbf = 0;
        local_2bd8 = (pointer)0x0;
        pTStack_2bd0 = (pointer)0x0;
        local_2be8 = 0;
        pTStack_2be0 = (pointer)0x0;
        local_2b88 = false;
        local_2ba8._16_8_ = 0;
        local_2ba8._24_8_ = 0;
        local_2ba8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2ba8._8_8_ = 0;
        auStack_2b80[0x10] = 0;
        auStack_2b80._17_8_ = 0;
        auStack_2b80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2b80[8] = 0;
        auStack_2b80._9_7_ = 0;
        local_2b44 = (storage_t<tinyusdz::Interpolation>)0x0;
        local_2b40 = false;
        local_2b3c = (storage_t<unsigned_int>)0x0;
        local_2b38.has_value_ = false;
        local_2b38.contained = (storage_t<bool>)0x0;
        local_2b30 = false;
        local_2ab8 = (storage_t<double>)0x0;
        local_2ab0 = false;
        local_29a8._16_8_ = 0;
        local_29a8._24_8_ = 0;
        local_29a8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_29a8._8_8_ = 0;
        local_2980._M_left = &local_2980;
        local_2980._M_color = _S_red;
        local_2980._M_parent = (_Base_ptr)0x0;
        local_2af8 = false;
        local_2b28._32_8_ = 0;
        local_2b28._40_8_ = 0;
        local_2b28._16_8_ = 0;
        local_2b28._24_8_ = 0;
        local_2b28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2b28._8_8_ = 0;
        local_2ac0 = false;
        local_2af0._32_8_ = 0;
        local_2af0._40_8_ = 0;
        local_2af0._16_8_ = 0;
        local_2af0._24_8_ = 0;
        local_2af0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2af0._8_8_ = 0;
        local_2a88 = false;
        local_2aa8._16_8_ = 0;
        local_2aa8._24_8_ = 0;
        local_2aa8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2aa8._8_8_ = 0;
        local_2a60 = false;
        local_2a80._16_8_ = 0;
        local_2a80._24_8_ = 0;
        local_2a80.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2a80._8_8_ = 0;
        local_2a38 = false;
        local_2a58._16_8_ = 0;
        local_2a58._24_8_ = 0;
        local_2a58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2a58._8_8_ = 0;
        local_2a00 = false;
        local_2a30._32_8_ = 0;
        local_2a30._40_8_ = 0;
        local_2a30._16_8_ = 0;
        local_2a30._24_8_ = 0;
        local_2a30.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2a30._8_8_ = 0;
        local_29d8 = false;
        local_29f8._16_8_ = 0;
        local_29f8._24_8_ = 0;
        local_29f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_29f8._8_8_ = 0;
        local_29b0 = false;
        local_29d0._16_8_ = 0;
        local_29d0._24_8_ = 0;
        local_29d0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_29d0._8_8_ = 0;
        auStack_2b60[0x10] = 0;
        auStack_2b60._17_8_ = 0;
        auStack_2b60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2b60[8] = 0;
        auStack_2b60._9_7_ = 0;
        local_2924 = (storage_t<tinyusdz::Purpose>)0x0;
        local_2920 = false;
        uStack_2930 = 0;
        uStack_292f = 0;
        pPStack_2940 = (pointer)0x0;
        uStack_2938 = 0;
        local_2937 = 0;
        local_2950 = (pointer)0x0;
        pSStack_2948 = (pointer)0x0;
        local_2960 = 0;
        pSStack_2958 = (pointer)0x0;
        local_291c = Default;
        local_2918 = false;
        local_2910 = ResetToExplicit;
        local_28d8 = (pointer)0x0;
        local_28e8 = (pointer)0x0;
        pPStack_28e0 = (pointer)0x0;
        local_28c8._M_left = &local_28c8;
        local_28c8._M_color = _S_red;
        local_28c8._M_parent = (_Base_ptr)0x0;
        uStack_28f8 = 0;
        uStack_28f4 = 0;
        pRStack_2908 = (pointer)0x0;
        uStack_2900 = 0;
        local_28fc = 0;
        local_28a8 = 0;
        local_2898._M_left = &local_2898;
        local_2898._M_color = _S_red;
        local_2898._M_parent = (_Base_ptr)0x0;
        local_283c = (storage_t<tinyusdz::Interpolation>)0x0;
        local_2838 = false;
        local_2834 = (storage_t<unsigned_int>)0x0;
        local_2830.has_value_ = false;
        local_2830.contained = (storage_t<bool>)0x0;
        local_2828 = false;
        local_27b0 = (storage_t<double>)0x0;
        local_27a8 = false;
        local_26a0._16_8_ = 0;
        local_26a0._24_8_ = 0;
        local_26a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_26a0._8_8_ = 0;
        local_2678._M_left = &local_2678;
        local_2678._M_color = _S_red;
        local_2678._M_parent = (_Base_ptr)0x0;
        local_27f0 = false;
        local_2820._32_8_ = 0;
        local_2820._40_8_ = 0;
        local_2820._16_8_ = 0;
        local_2820._24_8_ = 0;
        local_2820.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2820._8_8_ = 0;
        local_27b8 = false;
        local_27e8._32_8_ = 0;
        local_27e8._40_8_ = 0;
        local_27e8._16_8_ = 0;
        local_27e8._24_8_ = 0;
        local_27e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_27e8._8_8_ = 0;
        local_2780 = false;
        local_27a0._16_8_ = 0;
        local_27a0._24_8_ = 0;
        local_27a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_27a0._8_8_ = 0;
        local_2758 = false;
        local_2778._16_8_ = 0;
        local_2778._24_8_ = 0;
        local_2778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2778._8_8_ = 0;
        local_2730 = false;
        local_2750._16_8_ = 0;
        local_2750._24_8_ = 0;
        local_2750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2750._8_8_ = 0;
        local_26f8 = false;
        local_2728._32_8_ = 0;
        local_2728._40_8_ = 0;
        local_2728._16_8_ = 0;
        local_2728._24_8_ = 0;
        local_2728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2728._8_8_ = 0;
        local_26d0 = false;
        local_26f0._16_8_ = 0;
        local_26f0._24_8_ = 0;
        local_26f0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_26f0._8_8_ = 0;
        local_26a8 = false;
        local_26c8._16_8_ = 0;
        local_26c8._24_8_ = 0;
        local_26c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_26c8._8_8_ = 0;
        uStack_2848 = 0;
        uStack_2847 = 0;
        pTStack_2858 = (pointer)0x0;
        uStack_2850 = 0;
        local_284f = 0;
        local_2868 = (pointer)0x0;
        pTStack_2860 = (pointer)0x0;
        local_2878 = 0;
        pTStack_2870 = (pointer)0x0;
        local_2638 = false;
        local_2648 = (pointer)0x0;
        pSStack_2640 = (pointer)0x0;
        local_2658 = 0;
        pSStack_2650 = (pointer)0x0;
        bStack_2620 = false;
        uStack_261f = 0;
        pPStack_2630 = (pointer)0x0;
        uStack_2628 = 0;
        local_2627 = 0;
        local_2610[0x20] = 0;
        local_2610._33_7_ = 0;
        local_2610[0x28] = false;
        local_2610._16_8_ = 0;
        local_2610[0x18] = 0;
        local_2610._25_7_ = 0;
        local_2610._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2610._8_8_ = 0;
        local_2610[0x30] = 0;
        local_2610._52_4_ = 0.0;
        local_2610[0x38] = false;
        local_2610._60_4_ = 0;
        local_2610._64_2_ = 0;
        local_2610._72_2_ = local_2610._72_2_ & 0xff00;
        auStack_2568._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2548._0_8_ = local_2548._0_8_ & 0xffffffffffffff00;
        auStack_2438._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2428._0_8_ = 0;
        auStack_2448._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2438._0_8_ = 0;
        local_2408._0_8_ = local_2418;
        local_2418._0_4_ = 0;
        local_2410 = (undefined1  [8])0x0;
        auStack_25a0._16_8_ = auStack_25a0._16_8_ & 0xffffffffffffff00;
        auStack_25a0[0] = false;
        auStack_25a0._1_3_ = 0;
        auStack_25a0._4_4_ = (storage_t<unsigned_int>)0x0;
        auStack_25a0[8] = false;
        auStack_25a0._9_3_ = 0;
        auStack_25a0._12_4_ = (storage_t<unsigned_int>)0x0;
        auStack_25b8._8_8_ = 0;
        auStack_25b8[0x10] = false;
        auStack_25b8._17_3_ = 0;
        auStack_25b8._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_2610._80_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_25b8._0_8_ = 0;
        auStack_2568._16_8_ = auStack_2568._16_8_ & 0xffffffffffffff00;
        auStack_2568._0_8_ = 0;
        auStack_2568._8_8_ = 0;
        auStack_2580._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2580._16_8_ = 0;
        auStack_25a0._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2580._0_8_ = 0;
        auStack_2520._0_8_ = auStack_2520._0_8_ & 0xffffffffffffff00;
        auStack_2538._8_8_ = 0;
        auStack_2538._16_8_ = 0;
        local_2548._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2538._0_8_ = 0;
        auStack_2500._8_8_ = auStack_2500._8_8_ & 0xffffffffffffff00;
        auStack_2510._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2500._0_8_ = 0;
        auStack_2520._8_8_ = (storage_t<double>)0x0;
        auStack_2510._0_8_ = (storage_t<double>)0x0;
        auStack_24d0._0_8_ = auStack_24d0._0_8_ & 0xffffffffffffff00;
        auStack_24e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24e0._8_8_ = 0;
        local_24f0._0_8_ = 0;
        local_24f0._8_8_ = 0;
        auStack_24b0._24_8_ = auStack_24b0._24_8_ & 0xffffffffffffff00;
        auStack_24b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24b0._16_8_ = 0;
        auStack_24c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24b0._0_8_ = 0;
        auStack_24d0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24c0._0_8_ = 0;
        auStack_2480._16_8_ = auStack_2480._16_8_ & 0xffffffffffffff00;
        auStack_2480._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2480._8_8_ = 0;
        local_2490._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2490._8_8_ = 0;
        auStack_2448._0_8_ = auStack_2448._0_8_ & 0xffffffffffffff00;
        auStack_2458._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2458._8_8_ = 0;
        local_2468._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2468._8_8_ = 0;
        pSStack_23d8 = (pointer)((ulong)pSStack_23d8 & 0xffffffffffffff00);
        local_2408._32_8_ = 0;
        pSStack_23e0 = (pointer)0x0;
        local_2408._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2408._24_8_ = 0;
        uStack_23c0 = 0;
        local_23bf = 0;
        bStack_23b8 = false;
        local_23d0 = (pointer)0x0;
        bStack_23c8 = false;
        uStack_23c7 = 0;
        auStack_2380[0x10] = 0;
        auStack_2380._17_7_ = 0;
        auStack_2380[0x18] = 0;
        auStack_2380._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2380[8] = 0;
        auStack_2380._9_7_ = 0;
        auStack_23a0._16_8_ = (pointer)0x0;
        auStack_23a0._24_8_ = (pointer)0x0;
        auStack_23a0._0_8_ = (pointer)0x0;
        auStack_23a0._8_8_ = (pointer)0x0;
        auStack_23b0[0] = 0;
        auStack_23b0._1_7_ = 0;
        auStack_23b0._8_8_ = (pointer)0x0;
        auStack_2380._25_8_ = auStack_2380._25_8_ & 0xffffffffffffff;
        auStack_2380._36_4_ = 0;
        auStack_2380[0x28] = false;
        auStack_2380._44_4_ = 0;
        auStack_2380._48_2_ = 0;
        local_2348 = (optional<bool>)((ushort)local_2348 & 0xff00);
        auStack_22e8._24_8_ = 0;
        auStack_22e8._32_8_ = auStack_22e8._32_8_ & 0xffffffffffffff00;
        auStack_21b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21c8._8_8_ = 0;
        auStack_21b8._0_8_ = 0;
        local_2198._16_8_ = local_2198;
        local_2198._0_4_ = 0;
        local_2198._8_8_ = 0;
        auStack_2330._32_8_ = auStack_2330._32_8_ & 0xffffffffffffff00;
        auStack_2330[0x10] = false;
        auStack_2330._17_3_ = 0;
        auStack_2330._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        auStack_2330[0x18] = false;
        auStack_2330._25_3_ = 0;
        auStack_2330._28_4_ = (storage_t<unsigned_int>)0x0;
        auStack_2330._0_8_ = (pointer)0x0;
        auStack_2330._8_8_ = (pointer)0x0;
        local_2340._0_4_ = 0.0;
        local_2340._4_4_ = 0.0;
        local_2340._8_8_ = (pointer)0x0;
        auStack_22e8._16_8_ = auStack_22e8._16_8_ & 0xffffffffffffff00;
        auStack_22e8._0_8_ = 0;
        auStack_22e8._8_8_ = 0;
        auStack_22f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_22f8._8_8_ = 0;
        local_2308[0] = false;
        local_2308._1_3_ = 0;
        local_2308._4_4_ = (storage_t<unsigned_int>)0x0;
        local_2308._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_22b0._16_8_ = auStack_22b0._16_8_ & 0xffffffffffffff00;
        auStack_22b0._0_8_ = 0;
        auStack_22b0._8_8_ = 0;
        local_22c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_22c0._8_8_ = 0;
        auStack_2278._0_8_ = auStack_2278._0_8_ & 0xffffffffffffff00;
        auStack_2288._0_8_ = 0;
        auStack_2288._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2298._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2298._8_8_ = (storage_t<double>)0x0;
        auStack_2258._8_8_ = auStack_2258._8_8_ & 0xffffffffffffff00;
        auStack_2268._8_8_ = 0;
        auStack_2258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2278._8_8_ = 0;
        auStack_2268._0_8_ = 0;
        auStack_2218._0_8_ = auStack_2218._0_8_ & 0xffffffffffffff00;
        auStack_2228._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2228._8_8_ = 0;
        auStack_2238._0_8_ = 0;
        auStack_2238._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2248._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2248._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21f8._8_8_ = auStack_21f8._8_8_ & 0xffffffffffffff00;
        auStack_2208._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21f8._0_8_ = 0;
        auStack_2218._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2208._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21c8._0_8_ = auStack_21c8._0_8_ & 0xffffffffffffff00;
        auStack_21d8._0_8_ = 0;
        auStack_21d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_21e8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_21e8._8_8_ = 0;
        sStack_2168._24_8_ = local_2140;
        sStack_2168._16_8_ = sStack_2168._16_8_ & 0xffffffffffffff00;
        sStack_2168._0_8_ = 0;
        sStack_2168._8_8_ = 0;
        local_2180._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2180._16_8_ = 0;
        local_2148._M_p = (pointer)0x0;
        local_2140 = (undefined1  [8])((ulong)local_2140 & 0xffffffffffffff00);
        local_2f70._0_8_ = pcVar1;
        local_2c38._M_right = local_2c38._M_left;
        local_2c08._M_right = local_2c08._M_left;
        local_2980._M_right = local_2980._M_left;
        local_28c8._M_right = local_28c8._M_left;
        local_2898._M_right = local_2898._M_left;
        local_2678._M_right = local_2678._M_left;
        local_2408._8_8_ = local_2408._0_8_;
        local_2180._0_8_ = local_2198._16_8_;
        ReconstructShader<tinyusdz::UsdPrimvarReader<int>>
                  ((Specifier *)ppcVar11,properties,(ReferenceList *)local_2898._M_left,
                   (UsdPrimvarReader_int *)local_2f70,warn,err,in_stack_ffffffffffffce98);
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,"ReconstructPrim",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x1299);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,"UsdPrimvarReader_int",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          plVar8 = (long *)::std::__cxx11::string::_M_append
                                     ((char *)&local_3130,(ulong)(err->_M_dataplus)._M_p);
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_3158.field_2._M_allocated_capacity = *psVar10;
            local_3158.field_2._8_8_ = plVar8[3];
            local_3158._M_dataplus._M_p = (pointer)&local_3158.field_2;
          }
          else {
            local_3158.field_2._M_allocated_capacity = *psVar10;
            local_3158._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_3158._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
            operator_delete(local_3158._M_dataplus._M_p,local_3158.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
            operator_delete(local_3130._M_dataplus._M_p,local_3130.field_2._M_allocated_capacity + 1
                           );
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
        ::std::ios_base::~ios_base(local_3078);
        UsdPrimvarReader<int>::~UsdPrimvarReader((UsdPrimvarReader<int> *)local_2f70);
      }
      else {
        ppcVar11 = &local_3110;
        iVar5 = ::std::__cxx11::string::compare((char *)ppcVar11);
        if (iVar5 != 0) {
          ppcVar11 = &local_3110;
          iVar5 = ::std::__cxx11::string::compare((char *)ppcVar11);
          if (iVar5 == 0) {
            local_2f70._64_8_ = local_2f70 + 0x50;
            local_2f70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2f70._16_8_ = local_2f70._16_8_ & 0xffffffffffffff00;
            local_2f70._32_4_ = 0;
            local_2f70._40_8_ = -1;
            local_2f70._56_4_ = (storage_t<tinyusdz::Kind>)0x0;
            local_2f70[0x30] = false;
            local_2f70[0x31] = (storage_t<bool>)0x0;
            local_2f70[0x32] = false;
            local_2f70[0x33] = (storage_t<bool>)0x0;
            local_2f70[0x34] = false;
            local_2f70._72_8_ = 0;
            local_2f70[0x50] = '\0';
            local_2f70[0x60] = false;
            local_2dc8 = false;
            local_2c60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2c60._8_8_ = 0;
            local_2c60._16_8_ = 0;
            local_2c60._24_8_ = 0;
            local_2c38._M_left = &local_2c38;
            local_2c38._M_color = _S_red;
            local_2c38._M_parent = (_Base_ptr)0x0;
            local_2f70._104_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2f70._112_8_ = 0;
            local_2f70._120_8_ = 0;
            local_2f70._128_8_ = 0;
            local_2f70._136_8_ = 0;
            local_2f70._144_8_ = 0;
            local_2ed8 = false;
            local_2ea0 = false;
            local_2ed0._32_8_ = 0;
            local_2ed0._40_8_ = 0;
            local_2ed0._16_8_ = 0;
            local_2ed0._24_8_ = 0;
            local_2ed0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2ed0._8_8_ = 0;
            local_2e98.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2e98._8_8_ = 0;
            local_2e98._16_8_ = 0;
            local_2e98._24_8_ = 0;
            local_2e98._32_8_ = 0;
            local_2e98._40_8_ = 0;
            local_2e68 = false;
            local_2e60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2e60._8_8_ = 0;
            local_2e60._16_8_ = 0;
            local_2e60._24_8_ = 0;
            local_2e60._32_8_ = 0;
            local_2e60._40_8_ = 0;
            local_2e30 = false;
            local_2e28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2e28._8_8_ = 0;
            local_2e28._16_8_ = 0;
            local_2e28._24_8_ = 0;
            local_2e08 = false;
            local_2e00.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2e00._8_8_ = 0;
            local_2e00._16_8_ = 0;
            local_2e00._24_8_ = 0;
            local_2e00._32_8_ = 0;
            local_2e00._40_8_ = 0;
            local_2dd0.has_value_ = false;
            local_2dd0.contained = (storage_t<bool>)0x0;
            local_2d90 = false;
            local_2dc0._32_8_ = 0;
            local_2dc0._40_8_ = 0;
            local_2dc0._16_8_ = 0;
            local_2dc0._24_8_ = 0;
            local_2dc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2dc0._8_8_ = 0;
            local_2d68 = false;
            local_2d88._16_8_ = 0;
            local_2d88._24_8_ = 0;
            local_2d88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2d88._8_8_ = 0;
            local_2d40 = false;
            local_2d60._16_8_ = 0;
            local_2d60._24_8_ = 0;
            local_2d60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2d60._8_8_ = 0;
            local_2d18 = false;
            local_2d38._16_8_ = 0;
            local_2d38._24_8_ = 0;
            local_2d38.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2d38._8_8_ = 0;
            local_2cf0 = false;
            local_2d10._16_8_ = 0;
            local_2d10._24_8_ = 0;
            local_2d10.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2d10._8_8_ = 0;
            local_2cb8 = false;
            local_2ce8._32_8_ = 0;
            local_2ce8._40_8_ = 0;
            local_2ce8._16_8_ = 0;
            local_2ce8._24_8_ = 0;
            local_2ce8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2ce8._8_8_ = 0;
            local_2c90 = false;
            local_2cb0._16_8_ = 0;
            local_2cb0._24_8_ = 0;
            local_2cb0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2cb0._8_8_ = 0;
            local_2c68 = false;
            local_2c88._16_8_ = 0;
            local_2c88._24_8_ = 0;
            local_2c88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2c88._8_8_ = 0;
            local_2c18 = 0;
            local_2c08._M_left = &local_2c08;
            local_2c08._M_color = _S_red;
            local_2c08._M_parent = (_Base_ptr)0x0;
            uStack_2bb8 = 0;
            uStack_2bb7 = 0;
            pTStack_2bc8 = (pointer)0x0;
            uStack_2bc0 = 0;
            local_2bbf = 0;
            local_2bd8 = (pointer)0x0;
            pTStack_2bd0 = (pointer)0x0;
            local_2be8 = 0;
            pTStack_2be0 = (pointer)0x0;
            local_2b88 = false;
            local_2ba8._16_8_ = 0;
            local_2ba8._24_8_ = 0;
            local_2ba8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2ba8._8_8_ = 0;
            auStack_2b80[0x10] = 0;
            auStack_2b80._17_8_ = 0;
            auStack_2b80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2b80[8] = 0;
            auStack_2b80._9_7_ = 0;
            local_2b44 = (storage_t<tinyusdz::Interpolation>)0x0;
            local_2b40 = false;
            local_2b3c = (storage_t<unsigned_int>)0x0;
            local_2b38.has_value_ = false;
            local_2b38.contained = (storage_t<bool>)0x0;
            local_2b30 = false;
            local_2ab8 = (storage_t<double>)0x0;
            local_2ab0 = false;
            local_29a8._16_8_ = 0;
            local_29a8._24_8_ = 0;
            local_29a8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_29a8._8_8_ = 0;
            local_2980._M_left = &local_2980;
            local_2980._M_color = _S_red;
            local_2980._M_parent = (_Base_ptr)0x0;
            local_2af8 = false;
            local_2b28._32_8_ = 0;
            local_2b28._40_8_ = 0;
            local_2b28._16_8_ = 0;
            local_2b28._24_8_ = 0;
            local_2b28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2b28._8_8_ = 0;
            local_2ac0 = false;
            local_2af0._32_8_ = 0;
            local_2af0._40_8_ = 0;
            local_2af0._16_8_ = 0;
            local_2af0._24_8_ = 0;
            local_2af0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2af0._8_8_ = 0;
            local_2a88 = false;
            local_2aa8._16_8_ = 0;
            local_2aa8._24_8_ = 0;
            local_2aa8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2aa8._8_8_ = 0;
            local_2a60 = false;
            local_2a80._16_8_ = 0;
            local_2a80._24_8_ = 0;
            local_2a80.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2a80._8_8_ = 0;
            local_2a38 = false;
            local_2a58._16_8_ = 0;
            local_2a58._24_8_ = 0;
            local_2a58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2a58._8_8_ = 0;
            local_2a00 = false;
            local_2a30._32_8_ = 0;
            local_2a30._40_8_ = 0;
            local_2a30._16_8_ = 0;
            local_2a30._24_8_ = 0;
            local_2a30.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2a30._8_8_ = 0;
            local_29d8 = false;
            local_29f8._16_8_ = 0;
            local_29f8._24_8_ = 0;
            local_29f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_29f8._8_8_ = 0;
            local_29b0 = false;
            local_29d0._16_8_ = 0;
            local_29d0._24_8_ = 0;
            local_29d0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_29d0._8_8_ = 0;
            auStack_2b60[0x10] = 0;
            auStack_2b60._17_8_ = 0;
            auStack_2b60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2b60[8] = 0;
            auStack_2b60._9_7_ = 0;
            local_2924 = (storage_t<tinyusdz::Purpose>)0x0;
            local_2920 = false;
            uStack_2930 = 0;
            uStack_292f = 0;
            pPStack_2940 = (pointer)0x0;
            uStack_2938 = 0;
            local_2937 = 0;
            local_2950 = (pointer)0x0;
            pSStack_2948 = (pointer)0x0;
            local_2960 = 0;
            pSStack_2958 = (pointer)0x0;
            local_291c = Default;
            local_2918 = false;
            local_2910 = ResetToExplicit;
            local_28d8 = (pointer)0x0;
            local_28e8 = (pointer)0x0;
            pPStack_28e0 = (pointer)0x0;
            local_28c8._M_left = &local_28c8;
            local_28c8._M_color = _S_red;
            local_28c8._M_parent = (_Base_ptr)0x0;
            uStack_28f8 = 0;
            uStack_28f4 = 0;
            pRStack_2908 = (pointer)0x0;
            uStack_2900 = 0;
            local_28fc = 0;
            local_28a8 = 0;
            local_2898._M_left = &local_2898;
            local_2898._M_color = _S_red;
            local_2898._M_parent = (_Base_ptr)0x0;
            local_283c = (storage_t<tinyusdz::Interpolation>)0x0;
            local_2838 = false;
            local_2834 = (storage_t<unsigned_int>)0x0;
            local_2830.has_value_ = false;
            local_2830.contained = (storage_t<bool>)0x0;
            local_2828 = false;
            local_27b0 = (storage_t<double>)0x0;
            local_27a8 = false;
            local_26a0._16_8_ = 0;
            local_26a0._24_8_ = 0;
            local_26a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_26a0._8_8_ = 0;
            local_2678._M_left = &local_2678;
            local_2678._M_color = _S_red;
            local_2678._M_parent = (_Base_ptr)0x0;
            local_27f0 = false;
            local_2820._32_8_ = 0;
            local_2820._40_8_ = 0;
            local_2820._16_8_ = 0;
            local_2820._24_8_ = 0;
            local_2820.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2820._8_8_ = 0;
            local_27b8 = false;
            local_27e8._32_8_ = 0;
            local_27e8._40_8_ = 0;
            local_27e8._16_8_ = 0;
            local_27e8._24_8_ = 0;
            local_27e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_27e8._8_8_ = 0;
            local_2780 = false;
            local_27a0._16_8_ = 0;
            local_27a0._24_8_ = 0;
            local_27a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_27a0._8_8_ = 0;
            local_2758 = false;
            local_2778._16_8_ = 0;
            local_2778._24_8_ = 0;
            local_2778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2778._8_8_ = 0;
            local_2730 = false;
            local_2750._16_8_ = 0;
            local_2750._24_8_ = 0;
            local_2750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2750._8_8_ = 0;
            local_26f8 = false;
            local_2728._32_8_ = 0;
            local_2728._40_8_ = 0;
            local_2728._16_8_ = 0;
            local_2728._24_8_ = 0;
            local_2728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_2728._8_8_ = 0;
            local_26d0 = false;
            local_26f0._16_8_ = 0;
            local_26f0._24_8_ = 0;
            local_26f0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_26f0._8_8_ = 0;
            local_26a8 = false;
            local_26c8._16_8_ = 0;
            local_26c8._24_8_ = 0;
            local_26c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_26c8._8_8_ = 0;
            uStack_2848 = 0;
            uStack_2847 = 0;
            pTStack_2858 = (pointer)0x0;
            uStack_2850 = 0;
            local_284f = 0;
            local_2868 = (pointer)0x0;
            pTStack_2860 = (pointer)0x0;
            local_2878 = 0;
            pTStack_2870 = (pointer)0x0;
            local_2638 = false;
            local_2648 = (pointer)0x0;
            pSStack_2640 = (pointer)0x0;
            local_2658 = 0;
            pSStack_2650 = (pointer)0x0;
            bStack_2620 = false;
            uStack_261f = 0;
            pPStack_2630 = (pointer)0x0;
            uStack_2628 = 0;
            local_2627 = 0;
            local_2610[0x30] = 0;
            local_2610[0x20] = 0;
            local_2610._33_7_ = 0;
            local_2610[0x28] = false;
            local_2610._41_7_ = 0;
            local_2610._16_8_ = 0;
            local_2610[0x18] = 0;
            local_2610._25_7_ = 0;
            local_2610._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2610._8_8_ = 0;
            local_2610[0x38] = false;
            local_2610._60_4_ = 0;
            local_2610._64_2_ = local_2610._64_2_ & 0xff00;
            local_2610._68_4_ = 0;
            local_2610._72_2_ = 0;
            local_2610._80_8_ = local_2610._80_8_ & 0xffffffffffffff00;
            local_2548._0_8_ = 0;
            local_2548._8_8_ = local_2548._8_8_ & 0xffffffffffffff00;
            auStack_2428._0_8_ = 0;
            auStack_2428._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2438._0_8_ = 0;
            auStack_2438._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2408._8_8_ = local_2410;
            local_2410 = (undefined1  [8])((ulong)local_2410 & 0xffffffff00000000);
            local_2408._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_25a0._24_8_ = auStack_25a0._24_8_ & 0xffffffffffffff00;
            auStack_25a0[8] = false;
            auStack_25a0._9_3_ = 0;
            auStack_25a0._12_4_ = (storage_t<unsigned_int>)0x0;
            auStack_25a0._16_8_ = 0;
            auStack_25b8[0x10] = false;
            auStack_25b8._17_3_ = 0;
            auStack_25b8._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_25a0[0] = false;
            auStack_25a0._1_3_ = 0;
            auStack_25a0._4_4_ = (storage_t<unsigned_int>)0x0;
            auStack_25b8._0_8_ = 0;
            auStack_25b8._8_8_ = 0;
            auStack_2568._24_8_ = auStack_2568._24_8_ & 0xffffffffffffff00;
            auStack_2568._8_8_ = 0;
            auStack_2568._16_8_ = 0;
            auStack_2580._16_8_ = 0;
            auStack_2568._0_8_ = 0;
            auStack_2580._0_8_ = 0;
            auStack_2580._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2520._8_8_ = auStack_2520._8_8_ & 0xffffffffffffff00;
            auStack_2538._16_8_ = 0;
            auStack_2520._0_8_ = 0;
            auStack_2538._0_8_ = 0;
            auStack_2538._8_8_ = 0;
            local_24f0._0_8_ = local_24f0._0_8_ & 0xffffffffffffff00;
            auStack_2500._0_8_ = 0;
            auStack_2500._8_8_ = 0;
            auStack_2510._0_8_ = (storage_t<double>)0x0;
            auStack_2510._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_24d0._8_8_ = auStack_24d0._8_8_ & 0xffffffffffffff00;
            auStack_24e0._8_8_ = 0;
            auStack_24d0._0_8_ = 0;
            local_24f0._8_8_ = 0;
            auStack_24e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2490._0_8_ = local_2490._0_8_ & 0xffffffffffffff00;
            auStack_24b0._16_8_ = 0;
            auStack_24b0._24_8_ = 0;
            auStack_24b0._0_8_ = 0;
            auStack_24b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_24c0._0_8_ = 0;
            auStack_24c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2468._0_8_ = local_2468._0_8_ & 0xffffffffffffff00;
            auStack_2480._8_8_ = 0;
            auStack_2480._16_8_ = 0;
            local_2490._8_8_ = 0;
            auStack_2480._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2448._8_8_ = auStack_2448._8_8_ & 0xffffffffffffff00;
            auStack_2458._8_8_ = 0;
            auStack_2448._0_8_ = 0;
            local_2468._8_8_ = 0;
            auStack_2458._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_23d0 = (pointer)((ulong)local_23d0 & 0xffffffffffffff00);
            pSStack_23e0 = (pointer)0x0;
            pSStack_23d8 = (pointer)0x0;
            local_2408._24_8_ = 0;
            local_2408._32_8_ = 0;
            bStack_23b8 = false;
            uStack_23b7 = 0;
            auStack_23b0[0] = 0;
            bStack_23c8 = false;
            uStack_23c7 = 0;
            uStack_23c0 = 0;
            local_23bf = 0;
            auStack_2380[0x18] = 0;
            auStack_2380._25_8_ = 0;
            auStack_2380[8] = 0;
            auStack_2380._9_7_ = 0;
            auStack_2380[0x10] = 0;
            auStack_2380._17_7_ = 0;
            auStack_23a0._24_8_ = (pointer)0x0;
            auStack_2380._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_23a0._8_8_ = (pointer)0x0;
            auStack_23a0._16_8_ = (pointer)0x0;
            auStack_23b0._8_8_ = (pointer)0x0;
            auStack_23a0._0_8_ = (pointer)0x0;
            auStack_2380[0x28] = false;
            auStack_2380._44_4_ = 0;
            auStack_2380._48_2_ = auStack_2380._48_2_ & 0xff00;
            auStack_2380[0x34] = false;
            auStack_2380[0x35] = false;
            auStack_2380._54_2_ = 0;
            local_2348.has_value_ = false;
            local_2348.contained = (storage_t<bool>)0x0;
            local_2340._0_8_ = local_2340._0_8_ & 0xffffffffffffff00;
            auStack_22e8._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_22c0._0_8_ = local_22c0._0_8_ & 0xffffffffffffff00;
            auStack_21a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_21a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_21b8._0_8_ = 0;
            auStack_21b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2180._0_8_ = (long)local_2198 + 8;
            local_2198._8_8_ = local_2198._8_8_ & 0xffffffff00000000;
            local_2198._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2308._0_8_ = local_2308._0_8_ & 0xffffffffffffff00;
            auStack_2330[0x18] = false;
            auStack_2330._25_3_ = 0;
            auStack_2330._28_4_ = (storage_t<unsigned_int>)0x0;
            auStack_2330[0x20] = false;
            auStack_2330._33_3_ = 0;
            auStack_2330._36_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            auStack_2330._8_8_ = (pointer)0x0;
            auStack_2330[0x10] = false;
            auStack_2330._17_3_ = 0;
            auStack_2330._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
            local_2340._8_8_ = (pointer)0x0;
            auStack_2330._0_8_ = (pointer)0x0;
            auStack_22e8._24_8_ = auStack_22e8._24_8_ & 0xffffffffffffff00;
            auStack_22e8._8_8_ = 0;
            auStack_22e8._16_8_ = 0;
            auStack_22f8._8_8_ = 0;
            auStack_22e8._0_8_ = 0;
            local_2308._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_22f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2298._0_8_ = local_2298._0_8_ & 0xffffffffffffff00;
            auStack_22b0._8_8_ = 0;
            auStack_22b0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_22c0._8_8_ = 0;
            auStack_22b0._0_8_ = 0;
            auStack_2278._8_8_ = auStack_2278._8_8_ & 0xffffffffffffff00;
            auStack_2288._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2278._0_8_ = 0;
            local_2298._8_8_ = (storage_t<double>)0x0;
            auStack_2288._0_8_ = 0;
            local_2248._0_8_ = local_2248._0_8_ & 0xffffffffffffff00;
            auStack_2258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2258._8_8_ = 0;
            auStack_2268._0_8_ = 0;
            auStack_2268._8_8_ = 0;
            auStack_2218._8_8_ = auStack_2218._8_8_ & 0xffffffffffffff00;
            auStack_2228._8_8_ = 0;
            auStack_2218._0_8_ = 0;
            auStack_2238._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2228._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_2248._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2238._0_8_ = 0;
            local_21e8._0_8_ = local_21e8._0_8_ & 0xffffffffffffff00;
            auStack_21f8._0_8_ = 0;
            auStack_21f8._8_8_ = 0;
            auStack_2208._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_2208._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_21c8._8_8_ = auStack_21c8._8_8_ & 0xffffffffffffff00;
            auStack_21d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            auStack_21c8._0_8_ = 0;
            local_21e8._8_8_ = 0;
            auStack_21d8._0_8_ = 0;
            local_2148._M_p = (pointer)local_2138;
            sStack_2168._24_8_ = sStack_2168._24_8_ & 0xffffffffffffff00;
            sStack_2168._8_8_ = 0;
            sStack_2168._16_8_ = 0;
            local_2180._16_8_ = 0;
            sStack_2168._0_8_ = 0;
            local_2140 = (undefined1  [8])0x0;
            local_2138[0]._M_color._0_1_ = '\0';
            local_2f70._0_8_ = pcVar1;
            local_2c38._M_right = local_2c38._M_left;
            local_2c08._M_right = local_2c08._M_left;
            local_2980._M_right = local_2980._M_left;
            local_28c8._M_right = local_28c8._M_left;
            local_2898._M_right = local_2898._M_left;
            local_2678._M_right = local_2678._M_left;
            local_2408._16_8_ = local_2408._8_8_;
            local_2180._8_8_ = local_2180._0_8_;
            bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                              ((Specifier *)ppcVar11,properties,(ReferenceList *)local_2898._M_left,
                               (UsdPrimvarReader_float2 *)local_2f70,warn,err,
                               in_stack_ffffffffffffce98);
            pSVar2 = local_3138;
            if (bVar4) {
              ::std::__cxx11::string::operator=
                        ((string *)&local_3138->info_id,"UsdPrimvarReader_float2");
              linb::any::operator=
                        (&(pSVar2->value).v_,(UsdPrimvarReader<std::array<float,_2UL>_> *)local_2f70
                        );
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_30e8,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_30e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_30e8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12ab);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_30e8,"UsdPrimvarReader_float2",0x17);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1);
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_3158,&local_3130,err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                  operator_delete(local_3158._M_dataplus._M_p,
                                  local_3158.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                  operator_delete(local_3130._M_dataplus._M_p,
                                  local_3130.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
              ::std::ios_base::~ios_base(local_3078);
            }
            UsdPrimvarReader<std::array<float,_2UL>_>::~UsdPrimvarReader
                      ((UsdPrimvarReader<std::array<float,_2UL>_> *)local_2f70);
          }
          else {
            ppcVar11 = &local_3110;
            iVar5 = ::std::__cxx11::string::compare((char *)ppcVar11);
            if (iVar5 == 0) {
              local_2f70._64_8_ = local_2f70 + 0x50;
              local_2f70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2f70._16_8_ = local_2f70._16_8_ & 0xffffffffffffff00;
              local_2f70._32_4_ = 0;
              local_2f70._40_8_ = -1;
              local_2f70._56_4_ = (storage_t<tinyusdz::Kind>)0x0;
              local_2f70[0x30] = false;
              local_2f70[0x31] = (storage_t<bool>)0x0;
              local_2f70[0x32] = false;
              local_2f70[0x33] = (storage_t<bool>)0x0;
              local_2f70[0x34] = false;
              local_2f70._72_8_ = 0;
              local_2f70[0x50] = '\0';
              local_2f70[0x60] = false;
              local_2dc8 = false;
              local_2c60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2c60._8_8_ = 0;
              local_2c60._16_8_ = 0;
              local_2c60._24_8_ = 0;
              local_2c38._M_left = &local_2c38;
              local_2c38._M_color = _S_red;
              local_2c38._M_parent = (_Base_ptr)0x0;
              local_2f70._104_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2f70._112_8_ = 0;
              local_2f70._120_8_ = 0;
              local_2f70._128_8_ = 0;
              local_2f70._136_8_ = 0;
              local_2f70._144_8_ = 0;
              local_2ed8 = false;
              local_2ea0 = false;
              local_2ed0._32_8_ = 0;
              local_2ed0._40_8_ = 0;
              local_2ed0._16_8_ = 0;
              local_2ed0._24_8_ = 0;
              local_2ed0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2ed0._8_8_ = 0;
              local_2e98.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2e98._8_8_ = 0;
              local_2e98._16_8_ = 0;
              local_2e98._24_8_ = 0;
              local_2e98._32_8_ = 0;
              local_2e98._40_8_ = 0;
              local_2e68 = false;
              local_2e60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2e60._8_8_ = 0;
              local_2e60._16_8_ = 0;
              local_2e60._24_8_ = 0;
              local_2e60._32_8_ = 0;
              local_2e60._40_8_ = 0;
              local_2e30 = false;
              local_2e28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2e28._8_8_ = 0;
              local_2e28._16_8_ = 0;
              local_2e28._24_8_ = 0;
              local_2e08 = false;
              local_2e00.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2e00._8_8_ = 0;
              local_2e00._16_8_ = 0;
              local_2e00._24_8_ = 0;
              local_2e00._32_8_ = 0;
              local_2e00._40_8_ = 0;
              local_2dd0.has_value_ = false;
              local_2dd0.contained = (storage_t<bool>)0x0;
              local_2d90 = false;
              local_2dc0._32_8_ = 0;
              local_2dc0._40_8_ = 0;
              local_2dc0._16_8_ = 0;
              local_2dc0._24_8_ = 0;
              local_2dc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2dc0._8_8_ = 0;
              local_2d68 = false;
              local_2d88._16_8_ = 0;
              local_2d88._24_8_ = 0;
              local_2d88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2d88._8_8_ = 0;
              local_2d40 = false;
              local_2d60._16_8_ = 0;
              local_2d60._24_8_ = 0;
              local_2d60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2d60._8_8_ = 0;
              local_2d18 = false;
              local_2d38._16_8_ = 0;
              local_2d38._24_8_ = 0;
              local_2d38.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2d38._8_8_ = 0;
              local_2cf0 = false;
              local_2d10._16_8_ = 0;
              local_2d10._24_8_ = 0;
              local_2d10.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2d10._8_8_ = 0;
              local_2cb8 = false;
              local_2ce8._32_8_ = 0;
              local_2ce8._40_8_ = 0;
              local_2ce8._16_8_ = 0;
              local_2ce8._24_8_ = 0;
              local_2ce8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2ce8._8_8_ = 0;
              local_2c90 = false;
              local_2cb0._16_8_ = 0;
              local_2cb0._24_8_ = 0;
              local_2cb0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2cb0._8_8_ = 0;
              local_2c68 = false;
              local_2c88._16_8_ = 0;
              local_2c88._24_8_ = 0;
              local_2c88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2c88._8_8_ = 0;
              local_2c18 = 0;
              local_2c08._M_left = &local_2c08;
              local_2c08._M_color = _S_red;
              local_2c08._M_parent = (_Base_ptr)0x0;
              uStack_2bb8 = 0;
              uStack_2bb7 = 0;
              pTStack_2bc8 = (pointer)0x0;
              uStack_2bc0 = 0;
              local_2bbf = 0;
              local_2bd8 = (pointer)0x0;
              pTStack_2bd0 = (pointer)0x0;
              local_2be8 = 0;
              pTStack_2be0 = (pointer)0x0;
              local_2b88 = false;
              local_2ba8._16_8_ = 0;
              local_2ba8._24_8_ = 0;
              local_2ba8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2ba8._8_8_ = 0;
              auStack_2b80[0x10] = 0;
              auStack_2b80._17_8_ = 0;
              auStack_2b80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2b80[8] = 0;
              auStack_2b80._9_7_ = 0;
              local_2b44 = (storage_t<tinyusdz::Interpolation>)0x0;
              local_2b40 = false;
              local_2b3c = (storage_t<unsigned_int>)0x0;
              local_2b38.has_value_ = false;
              local_2b38.contained = (storage_t<bool>)0x0;
              local_2b30 = false;
              local_2ab8 = (storage_t<double>)0x0;
              local_2ab0 = false;
              local_29a8._16_8_ = 0;
              local_29a8._24_8_ = 0;
              local_29a8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_29a8._8_8_ = 0;
              local_2980._M_left = &local_2980;
              local_2980._M_color = _S_red;
              local_2980._M_parent = (_Base_ptr)0x0;
              local_2af8 = false;
              local_2b28._32_8_ = 0;
              local_2b28._40_8_ = 0;
              local_2b28._16_8_ = 0;
              local_2b28._24_8_ = 0;
              local_2b28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2b28._8_8_ = 0;
              local_2ac0 = false;
              local_2af0._32_8_ = 0;
              local_2af0._40_8_ = 0;
              local_2af0._16_8_ = 0;
              local_2af0._24_8_ = 0;
              local_2af0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2af0._8_8_ = 0;
              local_2a88 = false;
              local_2aa8._16_8_ = 0;
              local_2aa8._24_8_ = 0;
              local_2aa8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2aa8._8_8_ = 0;
              local_2a60 = false;
              local_2a80._16_8_ = 0;
              local_2a80._24_8_ = 0;
              local_2a80.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2a80._8_8_ = 0;
              local_2a38 = false;
              local_2a58._16_8_ = 0;
              local_2a58._24_8_ = 0;
              local_2a58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2a58._8_8_ = 0;
              local_2a00 = false;
              local_2a30._32_8_ = 0;
              local_2a30._40_8_ = 0;
              local_2a30._16_8_ = 0;
              local_2a30._24_8_ = 0;
              local_2a30.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2a30._8_8_ = 0;
              local_29d8 = false;
              local_29f8._16_8_ = 0;
              local_29f8._24_8_ = 0;
              local_29f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_29f8._8_8_ = 0;
              local_29b0 = false;
              local_29d0._16_8_ = 0;
              local_29d0._24_8_ = 0;
              local_29d0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_29d0._8_8_ = 0;
              auStack_2b60[0x10] = 0;
              auStack_2b60._17_8_ = 0;
              auStack_2b60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2b60[8] = 0;
              auStack_2b60._9_7_ = 0;
              local_2924 = (storage_t<tinyusdz::Purpose>)0x0;
              local_2920 = false;
              uStack_2930 = 0;
              uStack_292f = 0;
              pPStack_2940 = (pointer)0x0;
              uStack_2938 = 0;
              local_2937 = 0;
              local_2950 = (pointer)0x0;
              pSStack_2948 = (pointer)0x0;
              local_2960 = 0;
              pSStack_2958 = (pointer)0x0;
              local_291c = Default;
              local_2918 = false;
              local_2910 = ResetToExplicit;
              local_28d8 = (pointer)0x0;
              local_28e8 = (pointer)0x0;
              pPStack_28e0 = (pointer)0x0;
              local_28c8._M_left = &local_28c8;
              local_28c8._M_color = _S_red;
              local_28c8._M_parent = (_Base_ptr)0x0;
              uStack_28f8 = 0;
              uStack_28f4 = 0;
              pRStack_2908 = (pointer)0x0;
              uStack_2900 = 0;
              local_28fc = 0;
              local_28a8 = 0;
              local_2898._M_left = &local_2898;
              local_2898._M_color = _S_red;
              local_2898._M_parent = (_Base_ptr)0x0;
              local_283c = (storage_t<tinyusdz::Interpolation>)0x0;
              local_2838 = false;
              local_2834 = (storage_t<unsigned_int>)0x0;
              local_2830.has_value_ = false;
              local_2830.contained = (storage_t<bool>)0x0;
              local_2828 = false;
              local_27b0 = (storage_t<double>)0x0;
              local_27a8 = false;
              local_26a0._16_8_ = 0;
              local_26a0._24_8_ = 0;
              local_26a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_26a0._8_8_ = 0;
              local_2678._M_left = &local_2678;
              local_2678._M_color = _S_red;
              local_2678._M_parent = (_Base_ptr)0x0;
              local_27f0 = false;
              local_2820._32_8_ = 0;
              local_2820._40_8_ = 0;
              local_2820._16_8_ = 0;
              local_2820._24_8_ = 0;
              local_2820.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2820._8_8_ = 0;
              local_27b8 = false;
              local_27e8._32_8_ = 0;
              local_27e8._40_8_ = 0;
              local_27e8._16_8_ = 0;
              local_27e8._24_8_ = 0;
              local_27e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_27e8._8_8_ = 0;
              local_2780 = false;
              local_27a0._16_8_ = 0;
              local_27a0._24_8_ = 0;
              local_27a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_27a0._8_8_ = 0;
              local_2758 = false;
              local_2778._16_8_ = 0;
              local_2778._24_8_ = 0;
              local_2778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2778._8_8_ = 0;
              local_2730 = false;
              local_2750._16_8_ = 0;
              local_2750._24_8_ = 0;
              local_2750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2750._8_8_ = 0;
              local_26f8 = false;
              local_2728._32_8_ = 0;
              local_2728._40_8_ = 0;
              local_2728._16_8_ = 0;
              local_2728._24_8_ = 0;
              local_2728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_2728._8_8_ = 0;
              local_26d0 = false;
              local_26f0._16_8_ = 0;
              local_26f0._24_8_ = 0;
              local_26f0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_26f0._8_8_ = 0;
              local_26a8 = false;
              local_26c8._16_8_ = 0;
              local_26c8._24_8_ = 0;
              local_26c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              local_26c8._8_8_ = 0;
              uStack_2848 = 0;
              uStack_2847 = 0;
              pTStack_2858 = (pointer)0x0;
              uStack_2850 = 0;
              local_284f = 0;
              local_2868 = (pointer)0x0;
              pTStack_2860 = (pointer)0x0;
              local_2878 = 0;
              pTStack_2870 = (pointer)0x0;
              local_2638 = false;
              local_2648 = (pointer)0x0;
              pSStack_2640 = (pointer)0x0;
              local_2658 = 0;
              pSStack_2650 = (pointer)0x0;
              bStack_2620 = false;
              uStack_261f = 0;
              pPStack_2630 = (pointer)0x0;
              uStack_2628 = 0;
              local_2627 = 0;
              local_2610[0x30] = 0;
              local_2610[0x20] = 0;
              local_2610._33_7_ = 0;
              local_2610[0x28] = false;
              local_2610._41_7_ = 0;
              local_2610._16_8_ = 0;
              local_2610[0x18] = 0;
              local_2610._25_7_ = 0;
              local_2610._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2610._8_8_ = 0;
              local_2610[0x38] = false;
              local_2610._60_4_ = 0;
              local_2610._64_2_ = local_2610._64_2_ & 0xff00;
              local_2610._68_4_ = 0;
              local_2610._72_2_ = 0;
              local_2610._80_8_ = local_2610._80_8_ & 0xffffffffffffff00;
              local_2548._0_8_ = 0;
              local_2548._8_8_ = local_2548._8_8_ & 0xffffffffffffff00;
              auStack_2428._0_8_ = 0;
              auStack_2428._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2438._0_8_ = 0;
              auStack_2438._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2408._8_8_ = local_2410;
              local_2410 = (undefined1  [8])((ulong)local_2410 & 0xffffffff00000000);
              local_2408._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_25a0._24_8_ = auStack_25a0._24_8_ & 0xffffffffffffff00;
              auStack_25a0[8] = false;
              auStack_25a0._9_3_ = 0;
              auStack_25a0._12_4_ = (storage_t<unsigned_int>)0x0;
              auStack_25a0._16_8_ = 0;
              auStack_25b8[0x10] = false;
              auStack_25b8._17_3_ = 0;
              auStack_25b8._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
              auStack_25a0[0] = false;
              auStack_25a0._1_3_ = 0;
              auStack_25a0._4_4_ = (storage_t<unsigned_int>)0x0;
              auStack_25b8._0_8_ = 0;
              auStack_25b8._8_8_ = 0;
              auStack_2568._24_8_ = auStack_2568._24_8_ & 0xffffffffffffff00;
              auStack_2568._8_8_ = 0;
              auStack_2568._16_8_ = 0;
              auStack_2580._16_8_ = 0;
              auStack_2568._0_8_ = 0;
              auStack_2580._0_8_ = 0;
              auStack_2580._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2520._8_8_ = auStack_2520._8_8_ & 0xffffffffffffff00;
              auStack_2538._16_8_ = 0;
              auStack_2520._0_8_ = 0;
              auStack_2538._0_8_ = 0;
              auStack_2538._8_8_ = 0;
              local_24f0._0_8_ = local_24f0._0_8_ & 0xffffffffffffff00;
              auStack_2500._0_8_ = 0;
              auStack_2500._8_8_ = 0;
              auStack_2510._0_8_ = (storage_t<double>)0x0;
              auStack_2510._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_24d0._8_8_ = auStack_24d0._8_8_ & 0xffffffffffffff00;
              auStack_24e0._8_8_ = 0;
              auStack_24d0._0_8_ = 0;
              local_24f0._8_8_ = 0;
              auStack_24e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2490._0_8_ = local_2490._0_8_ & 0xffffffffffffff00;
              auStack_24b0._16_8_ = 0;
              auStack_24b0._24_8_ = 0;
              auStack_24b0._0_8_ = 0;
              auStack_24b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_24c0._0_8_ = 0;
              auStack_24c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2468._0_8_ = local_2468._0_8_ & 0xffffffffffffff00;
              auStack_2480._8_8_ = 0;
              auStack_2480._16_8_ = 0;
              local_2490._8_8_ = 0;
              auStack_2480._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2448._8_8_ = auStack_2448._8_8_ & 0xffffffffffffff00;
              auStack_2458._8_8_ = 0;
              auStack_2448._0_8_ = 0;
              local_2468._8_8_ = 0;
              auStack_2458._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_23d0 = (pointer)((ulong)local_23d0 & 0xffffffffffffff00);
              pSStack_23e0 = (pointer)0x0;
              pSStack_23d8 = (pointer)0x0;
              local_2408._24_8_ = 0;
              local_2408._32_8_ = 0;
              bStack_23b8 = false;
              uStack_23b7 = 0;
              auStack_23b0[0] = 0;
              bStack_23c8 = false;
              uStack_23c7 = 0;
              uStack_23c0 = 0;
              local_23bf = 0;
              auStack_2380[0x18] = 0;
              auStack_2380._25_8_ = 0;
              auStack_2380[8] = 0;
              auStack_2380._9_7_ = 0;
              auStack_2380[0x10] = 0;
              auStack_2380._17_7_ = 0;
              auStack_23a0._24_8_ = (pointer)0x0;
              auStack_2380._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_23a0._8_8_ = (pointer)0x0;
              auStack_23a0._16_8_ = (pointer)0x0;
              auStack_23b0._8_8_ = (pointer)0x0;
              auStack_23a0._0_8_ = (pointer)0x0;
              auStack_2380[0x28] = false;
              auStack_2380._44_4_ = 0;
              auStack_2380._48_2_ = auStack_2380._48_2_ & 0xff00;
              auStack_2380[0x34] = false;
              auStack_2380[0x35] = false;
              auStack_2380._54_2_ = 0;
              local_2348.has_value_ = false;
              local_2348.contained = (storage_t<bool>)0x0;
              local_2340._0_8_ = local_2340._0_8_ & 0xffffffffffffff00;
              auStack_22e8._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_22c0._0_8_ = local_22c0._0_8_ & 0xffffffffffffff00;
              auStack_21a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_21a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_21b8._0_8_ = 0;
              auStack_21b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2180._0_8_ = (long)local_2198 + 8;
              local_2198._8_8_ = local_2198._8_8_ & 0xffffffff00000000;
              local_2198._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2308._0_8_ = local_2308._0_8_ & 0xffffffffffffff00;
              auStack_2330[0x18] = false;
              auStack_2330._25_3_ = 0;
              auStack_2330._28_4_ = (storage_t<unsigned_int>)0x0;
              auStack_2330[0x20] = false;
              auStack_2330._33_3_ = 0;
              auStack_2330._36_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
              auStack_2330._8_8_ = (pointer)0x0;
              auStack_2330[0x10] = false;
              auStack_2330._17_3_ = 0;
              auStack_2330._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
              local_2340._8_8_ = (pointer)0x0;
              auStack_2330._0_8_ = (pointer)0x0;
              auStack_22e8._24_8_ = auStack_22e8._24_8_ & 0xffffffffffffff00;
              auStack_22e8._8_8_ = 0;
              auStack_22e8._16_8_ = 0;
              auStack_22f8._8_8_ = 0;
              auStack_22e8._0_8_ = 0;
              local_2308._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_22f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2298._0_8_ = local_2298._0_8_ & 0xffffffffffffff00;
              auStack_22b0._8_8_ = 0;
              auStack_22b0._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_22c0._8_8_ = 0;
              auStack_22b0._0_8_ = 0;
              auStack_2278._8_8_ = auStack_2278._8_8_ & 0xffffffffffffff00;
              auStack_2288._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2278._0_8_ = 0;
              local_2298._8_8_ = (storage_t<double>)0x0;
              auStack_2288._0_8_ = 0;
              local_2248._0_8_ = local_2248._0_8_ & 0xffffffffffffff00;
              auStack_2258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2258._8_8_ = 0;
              auStack_2268._0_8_ = 0;
              auStack_2268._8_8_ = 0;
              auStack_2218._8_8_ = auStack_2218._8_8_ & 0xffffffffffffff00;
              auStack_2228._8_8_ = 0;
              auStack_2218._0_8_ = 0;
              auStack_2238._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2228._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_2248._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2238._0_8_ = 0;
              local_21e8._0_8_ = local_21e8._0_8_ & 0xffffffffffffff00;
              auStack_21f8._0_8_ = 0;
              auStack_21f8._8_8_ = 0;
              auStack_2208._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_2208._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_21c8._8_8_ = auStack_21c8._8_8_ & 0xffffffffffffff00;
              auStack_21d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              auStack_21c8._0_8_ = 0;
              local_21e8._8_8_ = 0;
              auStack_21d8._0_8_ = 0;
              local_2148._M_p = (pointer)local_2138;
              sStack_2168._24_8_ = sStack_2168._24_8_ & 0xffffffffffffff00;
              sStack_2168._8_8_ = 0;
              sStack_2168._16_8_ = 0;
              local_2180._16_8_ = 0;
              sStack_2168._0_8_ = 0;
              local_2140 = (undefined1  [8])0x0;
              local_2138[0]._M_color._0_1_ = '\0';
              local_2f70._0_8_ = pcVar1;
              local_2c38._M_right = local_2c38._M_left;
              local_2c08._M_right = local_2c08._M_left;
              local_2980._M_right = local_2980._M_left;
              local_28c8._M_right = local_28c8._M_left;
              local_2898._M_right = local_2898._M_left;
              local_2678._M_right = local_2678._M_left;
              local_2408._16_8_ = local_2408._8_8_;
              local_2180._8_8_ = local_2180._0_8_;
              bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                ((Specifier *)ppcVar11,properties,
                                 (ReferenceList *)local_2898._M_left,
                                 (UsdPrimvarReader_float3 *)local_2f70,warn,err,
                                 in_stack_ffffffffffffce98);
              pSVar2 = local_3138;
              if (bVar4) {
                ::std::__cxx11::string::operator=
                          ((string *)&local_3138->info_id,"UsdPrimvarReader_float3");
                linb::any::operator=
                          (&(pSVar2->value).v_,
                           (UsdPrimvarReader<std::array<float,_3UL>_> *)local_2f70);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_30e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_30e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_30e8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12b4);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_30e8,"UsdPrimvarReader_float3",0x17);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+(&local_3158,&local_3130,err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                    operator_delete(local_3158._M_dataplus._M_p,
                                    local_3158.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                    operator_delete(local_3130._M_dataplus._M_p,
                                    local_3130.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                ::std::ios_base::~ios_base(local_3078);
              }
              UsdPrimvarReader<std::array<float,_3UL>_>::~UsdPrimvarReader
                        ((UsdPrimvarReader<std::array<float,_3UL>_> *)local_2f70);
            }
            else {
              iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
              if (iVar5 == 0) {
                spec_02 = (UsdPrimvarReader<std::array<float,_4UL>_> *)local_2f70;
                UsdPrimvarReader<std::array<float,_4UL>_>::UsdPrimvarReader
                          ((UsdPrimvarReader<std::array<float,_4UL>_> *)local_2f70);
                bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                  ((Specifier *)spec_02,properties,references_03,
                                   (UsdPrimvarReader<std::array<float,_4UL>_> *)local_2f70,warn,err,
                                   in_stack_ffffffffffffce98);
                pSVar2 = local_3138;
                if (bVar4) {
                  ::std::__cxx11::string::operator=
                            ((string *)&local_3138->info_id,"UsdPrimvarReader_float4");
                  linb::any::operator=
                            (&(pSVar2->value).v_,
                             (UsdPrimvarReader<std::array<float,_4UL>_> *)local_2f70);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_30e8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_30e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_30e8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_30e8,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12bd);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_30e8,"UsdPrimvarReader_float4",0x17);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1)
                  ;
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+(&local_3158,&local_3130,err);
                    ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                      operator_delete(local_3158._M_dataplus._M_p,
                                      local_3158.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                      operator_delete(local_3130._M_dataplus._M_p,
                                      local_3130.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                  ::std::ios_base::~ios_base(local_3078);
                }
                UsdPrimvarReader<std::array<float,_4UL>_>::~UsdPrimvarReader
                          ((UsdPrimvarReader<std::array<float,_4UL>_> *)local_2f70);
              }
              else {
                iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
                if (iVar5 == 0) {
                  spec_03 = (UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_2f70;
                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2f70);
                  bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                    ((Specifier *)spec_03,properties,references_04,
                                     (UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2f70,warn,err,in_stack_ffffffffffffce98);
                  pSVar2 = local_3138;
                  if (bVar4) {
                    ::std::__cxx11::string::operator=
                              ((string *)&local_3138->info_id,"UsdPrimvarReader_string");
                    linb::any::operator=
                              (&(pSVar2->value).v_,
                               (UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_2f70);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,"():",3);
                    poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12c6);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,"UsdPrimvarReader_string",0x17);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_30e8,"\n",1);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+(&local_3158,&local_3130,err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                        operator_delete(local_3158._M_dataplus._M_p,
                                        local_3158.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                        operator_delete(local_3130._M_dataplus._M_p,
                                        local_3130.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                    ::std::ios_base::~ios_base(local_3078);
                  }
                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_2f70);
                }
                else {
                  iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
                  if (iVar5 == 0) {
                    spec_04 = (UsdPrimvarReader<tinyusdz::value::vector3f> *)local_2f70;
                    UsdPrimvarReader<tinyusdz::value::vector3f>::UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::vector3f> *)local_2f70);
                    bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                      ((Specifier *)spec_04,properties,references_05,
                                       (UsdPrimvarReader<tinyusdz::value::vector3f> *)local_2f70,
                                       warn,err,in_stack_ffffffffffffce98);
                    pSVar2 = local_3138;
                    if (bVar4) {
                      ::std::__cxx11::string::operator=
                                ((string *)&local_3138->info_id,"UsdPrimvarReader_vector");
                      linb::any::operator=
                                (&(pSVar2->value).v_,
                                 (UsdPrimvarReader<tinyusdz::value::vector3f> *)local_2f70);
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,"():",3);
                      poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12cf);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,"UsdPrimvarReader_vector",0x17);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_30e8,"\n",1);
                      if (err != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+(&local_3158,&local_3130,err);
                        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                          operator_delete(local_3158._M_dataplus._M_p,
                                          local_3158.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                          operator_delete(local_3130._M_dataplus._M_p,
                                          local_3130.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                      ::std::ios_base::~ios_base(local_3078);
                    }
                    UsdPrimvarReader<tinyusdz::value::vector3f>::~UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::vector3f> *)local_2f70);
                  }
                  else {
                    iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
                    if (iVar5 == 0) {
                      spec_05 = (UsdPrimvarReader<tinyusdz::value::normal3f> *)local_2f70;
                      UsdPrimvarReader<tinyusdz::value::normal3f>::UsdPrimvarReader
                                ((UsdPrimvarReader<tinyusdz::value::normal3f> *)local_2f70);
                      bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                        ((Specifier *)spec_05,properties,references_06,
                                         (UsdPrimvarReader<tinyusdz::value::normal3f> *)local_2f70,
                                         warn,err,in_stack_ffffffffffffce98);
                      pSVar2 = local_3138;
                      if (bVar4) {
                        ::std::__cxx11::string::operator=
                                  ((string *)&local_3138->info_id,"UsdPrimvarReader_normal");
                        linb::any::operator=
                                  (&(pSVar2->value).v_,
                                   (UsdPrimvarReader<tinyusdz::value::normal3f> *)local_2f70);
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,"():",3);
                        poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12d8);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,"UsdPrimvarReader_normal",0x17);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_30e8,"\n",1);
                        if (err != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+(&local_3158,&local_3130,err);
                          ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                            operator_delete(local_3158._M_dataplus._M_p,
                                            local_3158.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                            operator_delete(local_3130._M_dataplus._M_p,
                                            local_3130.field_2._M_allocated_capacity + 1);
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
                        ::std::ios_base::~ios_base(local_3078);
                      }
                      UsdPrimvarReader<tinyusdz::value::normal3f>::~UsdPrimvarReader
                                ((UsdPrimvarReader<tinyusdz::value::normal3f> *)local_2f70);
                    }
                    else {
                      iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
                      if (iVar5 == 0) {
                        spec_06 = (UsdPrimvarReader<tinyusdz::value::point3f> *)local_2f70;
                        UsdPrimvarReader<tinyusdz::value::point3f>::UsdPrimvarReader
                                  ((UsdPrimvarReader<tinyusdz::value::point3f> *)local_2f70);
                        bVar4 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                          ((Specifier *)spec_06,properties,references_07,
                                           (UsdPrimvarReader<tinyusdz::value::point3f> *)local_2f70,
                                           warn,err,in_stack_ffffffffffffce98);
                        pSVar2 = local_3138;
                        if (bVar4) {
                          ::std::__cxx11::string::operator=
                                    ((string *)&local_3138->info_id,"UsdPrimvarReader_point");
                          linb::any::operator=
                                    (&(pSVar2->value).v_,
                                     (UsdPrimvarReader<tinyusdz::value::point3f> *)local_2f70);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,"():",3);
                          poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12e1);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,"UsdPrimvarReader_point",0x16);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_30e8,"\n",1);
                          if (err != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+(&local_3158,&local_3130,err);
                            ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                              operator_delete(local_3158._M_dataplus._M_p,
                                              local_3158.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                              operator_delete(local_3130._M_dataplus._M_p,
                                              local_3130.field_2._M_allocated_capacity + 1);
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8)
                          ;
                          ::std::ios_base::~ios_base(local_3078);
                        }
                        UsdPrimvarReader<tinyusdz::value::point3f>::~UsdPrimvarReader
                                  ((UsdPrimvarReader<tinyusdz::value::point3f> *)local_2f70);
                      }
                      else {
                        iVar5 = ::std::__cxx11::string::compare((char *)&local_3110);
                        if (iVar5 == 0) {
                          pUVar12 = (UsdTransform2d *)local_2f70;
                          UsdTransform2d::UsdTransform2d((UsdTransform2d *)local_2f70);
                          bVar4 = ReconstructShader<tinyusdz::UsdTransform2d>
                                            ((Specifier *)pUVar12,properties,references_08,
                                             (UsdTransform2d *)local_2f70,warn,err,
                                             in_stack_ffffffffffffce98);
                          pSVar2 = local_3138;
                          if (bVar4) {
                            ::std::__cxx11::string::operator=
                                      ((string *)&local_3138->info_id,"UsdTransform2d");
                            linb::any::operator=(&(pSVar2->value).v_,(UsdTransform2d *)local_2f70);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream
                                      ((ostringstream *)local_30e8);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"():",3);
                            poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12ea);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"UsdTransform2d",0xe);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"\n",1);
                            if (err != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+(&local_3158,&local_3130,err);
                              ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158)
                              ;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                                operator_delete(local_3158._M_dataplus._M_p,
                                                local_3158.field_2._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                                operator_delete(local_3130._M_dataplus._M_p,
                                                local_3130.field_2._M_allocated_capacity + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_30e8);
                            ::std::ios_base::~ios_base(local_3078);
                          }
                          UsdTransform2d::~UsdTransform2d((UsdTransform2d *)local_2f70);
                        }
                        else {
                          pUVar12 = (UsdTransform2d *)local_2f70;
                          ShaderNode::ShaderNode((ShaderNode *)local_2f70);
                          bVar4 = ReconstructShader<tinyusdz::ShaderNode>
                                            ((Specifier *)pUVar12,properties,references_00,
                                             (ShaderNode *)local_2f70,warn,err,
                                             in_stack_ffffffffffffce98);
                          pSVar2 = local_3138;
                          if (bVar4) {
                            if (local_3108 != 0) {
                              ::std::__cxx11::string::_M_assign((string *)&local_3138->info_id);
                            }
                            linb::any::operator=(&(pSVar2->value).v_,(ShaderNode *)local_2f70);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream
                                      ((ostringstream *)local_30e8);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"():",3);
                            poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12f3);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
                            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)local_30e8,local_3110,local_3108);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                            if (err != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+(&local_3158,&local_3130,err);
                              ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158)
                              ;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
                                operator_delete(local_3158._M_dataplus._M_p,
                                                local_3158.field_2._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
                                operator_delete(local_3130._M_dataplus._M_p,
                                                local_3130.field_2._M_allocated_capacity + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_30e8);
                            ::std::ios_base::~ios_base(local_3078);
                          }
                          UsdShadePrim::~UsdShadePrim((UsdShadePrim *)local_2f70);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_00247afd;
        }
        local_2f70._64_8_ = local_2f70 + 0x50;
        local_2f70._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2f70._16_8_ = local_2f70._16_8_ & 0xffffffffffffff00;
        local_2f70._32_4_ = 0;
        local_2f70._40_8_ = -1;
        local_2f70._56_4_ = (storage_t<tinyusdz::Kind>)0x0;
        local_2f70[0x30] = false;
        local_2f70[0x31] = (storage_t<bool>)0x0;
        local_2f70[0x32] = false;
        local_2f70[0x33] = (storage_t<bool>)0x0;
        local_2f70[0x34] = false;
        local_2f70._72_8_ = 0;
        local_2f70[0x50] = '\0';
        local_2f70[0x60] = false;
        local_2dc8 = false;
        local_2c60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2c60._8_8_ = 0;
        local_2c60._16_8_ = 0;
        local_2c60._24_8_ = 0;
        local_2c38._M_left = &local_2c38;
        local_2c38._M_color = _S_red;
        local_2c38._M_parent = (_Base_ptr)0x0;
        local_2f70._104_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2f70._112_8_ = 0;
        local_2f70._120_8_ = 0;
        local_2f70._128_8_ = 0;
        local_2f70._136_8_ = 0;
        local_2f70._144_8_ = 0;
        local_2ed8 = false;
        local_2ea0 = false;
        local_2ed0._32_8_ = 0;
        local_2ed0._40_8_ = 0;
        local_2ed0._16_8_ = 0;
        local_2ed0._24_8_ = 0;
        local_2ed0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2ed0._8_8_ = 0;
        local_2e98.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e98._8_8_ = 0;
        local_2e98._16_8_ = 0;
        local_2e98._24_8_ = 0;
        local_2e98._32_8_ = 0;
        local_2e98._40_8_ = 0;
        local_2e68 = false;
        local_2e60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e60._8_8_ = 0;
        local_2e60._16_8_ = 0;
        local_2e60._24_8_ = 0;
        local_2e60._32_8_ = 0;
        local_2e60._40_8_ = 0;
        local_2e30 = false;
        local_2e28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e28._8_8_ = 0;
        local_2e28._16_8_ = 0;
        local_2e28._24_8_ = 0;
        local_2e08 = false;
        local_2e00.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2e00._8_8_ = 0;
        local_2e00._16_8_ = 0;
        local_2e00._24_8_ = 0;
        local_2e00._32_8_ = 0;
        local_2e00._40_8_ = 0;
        local_2dd0.has_value_ = false;
        local_2dd0.contained = (storage_t<bool>)0x0;
        local_2d90 = false;
        local_2dc0._32_8_ = 0;
        local_2dc0._40_8_ = 0;
        local_2dc0._16_8_ = 0;
        local_2dc0._24_8_ = 0;
        local_2dc0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2dc0._8_8_ = 0;
        local_2d68 = false;
        local_2d88._16_8_ = 0;
        local_2d88._24_8_ = 0;
        local_2d88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d88._8_8_ = 0;
        local_2d40 = false;
        local_2d60._16_8_ = 0;
        local_2d60._24_8_ = 0;
        local_2d60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d60._8_8_ = 0;
        local_2d18 = false;
        local_2d38._16_8_ = 0;
        local_2d38._24_8_ = 0;
        local_2d38.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d38._8_8_ = 0;
        local_2cf0 = false;
        local_2d10._16_8_ = 0;
        local_2d10._24_8_ = 0;
        local_2d10.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2d10._8_8_ = 0;
        local_2cb8 = false;
        local_2ce8._32_8_ = 0;
        local_2ce8._40_8_ = 0;
        local_2ce8._16_8_ = 0;
        local_2ce8._24_8_ = 0;
        local_2ce8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2ce8._8_8_ = 0;
        local_2c90 = false;
        local_2cb0._16_8_ = 0;
        local_2cb0._24_8_ = 0;
        local_2cb0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2cb0._8_8_ = 0;
        local_2c68 = false;
        local_2c88._16_8_ = 0;
        local_2c88._24_8_ = 0;
        local_2c88.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2c88._8_8_ = 0;
        local_2c18 = 0;
        local_2c08._M_left = &local_2c08;
        local_2c08._M_color = _S_red;
        local_2c08._M_parent = (_Base_ptr)0x0;
        uStack_2bb8 = 0;
        uStack_2bb7 = 0;
        pTStack_2bc8 = (pointer)0x0;
        uStack_2bc0 = 0;
        local_2bbf = 0;
        local_2bd8 = (pointer)0x0;
        pTStack_2bd0 = (pointer)0x0;
        local_2be8 = 0;
        pTStack_2be0 = (pointer)0x0;
        local_2b88 = false;
        local_2ba8._16_8_ = 0;
        local_2ba8._24_8_ = 0;
        local_2ba8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2ba8._8_8_ = 0;
        auStack_2b80[0x10] = 0;
        auStack_2b80._17_8_ = 0;
        auStack_2b80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2b80[8] = 0;
        auStack_2b80._9_7_ = 0;
        local_2b44 = (storage_t<tinyusdz::Interpolation>)0x0;
        local_2b40 = false;
        local_2b3c = (storage_t<unsigned_int>)0x0;
        local_2b38.has_value_ = false;
        local_2b38.contained = (storage_t<bool>)0x0;
        local_2b30 = false;
        local_2ab8 = (storage_t<double>)0x0;
        local_2ab0 = false;
        local_29a8._16_8_ = 0;
        local_29a8._24_8_ = 0;
        local_29a8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_29a8._8_8_ = 0;
        local_2980._M_left = &local_2980;
        local_2980._M_color = _S_red;
        local_2980._M_parent = (_Base_ptr)0x0;
        local_2af8 = false;
        local_2b28._32_8_ = 0;
        local_2b28._40_8_ = 0;
        local_2b28._16_8_ = 0;
        local_2b28._24_8_ = 0;
        local_2b28.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2b28._8_8_ = 0;
        local_2ac0 = false;
        local_2af0._32_8_ = 0;
        local_2af0._40_8_ = 0;
        local_2af0._16_8_ = 0;
        local_2af0._24_8_ = 0;
        local_2af0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2af0._8_8_ = 0;
        local_2a88 = false;
        local_2aa8._16_8_ = 0;
        local_2aa8._24_8_ = 0;
        local_2aa8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2aa8._8_8_ = 0;
        local_2a60 = false;
        local_2a80._16_8_ = 0;
        local_2a80._24_8_ = 0;
        local_2a80.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2a80._8_8_ = 0;
        local_2a38 = false;
        local_2a58._16_8_ = 0;
        local_2a58._24_8_ = 0;
        local_2a58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2a58._8_8_ = 0;
        local_2a00 = false;
        local_2a30._32_8_ = 0;
        local_2a30._40_8_ = 0;
        local_2a30._16_8_ = 0;
        local_2a30._24_8_ = 0;
        local_2a30.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2a30._8_8_ = 0;
        local_29d8 = false;
        local_29f8._16_8_ = 0;
        local_29f8._24_8_ = 0;
        local_29f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_29f8._8_8_ = 0;
        local_29b0 = false;
        local_29d0._16_8_ = 0;
        local_29d0._24_8_ = 0;
        local_29d0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_29d0._8_8_ = 0;
        auStack_2b60[0x10] = 0;
        auStack_2b60._17_8_ = 0;
        auStack_2b60._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2b60[8] = 0;
        auStack_2b60._9_7_ = 0;
        local_2924 = (storage_t<tinyusdz::Purpose>)0x0;
        local_2920 = false;
        uStack_2930 = 0;
        uStack_292f = 0;
        pPStack_2940 = (pointer)0x0;
        uStack_2938 = 0;
        local_2937 = 0;
        local_2950 = (pointer)0x0;
        pSStack_2948 = (pointer)0x0;
        local_2960 = 0;
        pSStack_2958 = (pointer)0x0;
        local_291c = Default;
        local_2918 = false;
        local_2910 = ResetToExplicit;
        local_28d8 = (pointer)0x0;
        local_28e8 = (pointer)0x0;
        pPStack_28e0 = (pointer)0x0;
        local_28c8._M_left = &local_28c8;
        local_28c8._M_color = _S_red;
        local_28c8._M_parent = (_Base_ptr)0x0;
        uStack_28f8 = 0;
        uStack_28f4 = 0;
        pRStack_2908 = (pointer)0x0;
        uStack_2900 = 0;
        local_28fc = 0;
        local_28a8 = 0;
        local_2898._M_left = &local_2898;
        local_2898._M_color = _S_red;
        local_2898._M_parent = (_Base_ptr)0x0;
        local_283c = (storage_t<tinyusdz::Interpolation>)0x0;
        local_2838 = false;
        local_2834 = (storage_t<unsigned_int>)0x0;
        local_2830.has_value_ = false;
        local_2830.contained = (storage_t<bool>)0x0;
        local_2828 = false;
        local_27b0 = (storage_t<double>)0x0;
        local_27a8 = false;
        local_26a0._16_8_ = 0;
        local_26a0._24_8_ = 0;
        local_26a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_26a0._8_8_ = 0;
        local_2678._M_left = &local_2678;
        local_2678._M_color = _S_red;
        local_2678._M_parent = (_Base_ptr)0x0;
        local_27f0 = false;
        local_2820._32_8_ = 0;
        local_2820._40_8_ = 0;
        local_2820._16_8_ = 0;
        local_2820._24_8_ = 0;
        local_2820.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2820._8_8_ = 0;
        local_27b8 = false;
        local_27e8._32_8_ = 0;
        local_27e8._40_8_ = 0;
        local_27e8._16_8_ = 0;
        local_27e8._24_8_ = 0;
        local_27e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_27e8._8_8_ = 0;
        local_2780 = false;
        local_27a0._16_8_ = 0;
        local_27a0._24_8_ = 0;
        local_27a0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_27a0._8_8_ = 0;
        local_2758 = false;
        local_2778._16_8_ = 0;
        local_2778._24_8_ = 0;
        local_2778.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2778._8_8_ = 0;
        local_2730 = false;
        local_2750._16_8_ = 0;
        local_2750._24_8_ = 0;
        local_2750.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2750._8_8_ = 0;
        local_26f8 = false;
        local_2728._32_8_ = 0;
        local_2728._40_8_ = 0;
        local_2728._16_8_ = 0;
        local_2728._24_8_ = 0;
        local_2728.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_2728._8_8_ = 0;
        local_26d0 = false;
        local_26f0._16_8_ = 0;
        local_26f0._24_8_ = 0;
        local_26f0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_26f0._8_8_ = 0;
        local_26a8 = false;
        local_26c8._16_8_ = 0;
        local_26c8._24_8_ = 0;
        local_26c8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_26c8._8_8_ = 0;
        uStack_2848 = 0;
        uStack_2847 = 0;
        pTStack_2858 = (pointer)0x0;
        uStack_2850 = 0;
        local_284f = 0;
        local_2868 = (pointer)0x0;
        pTStack_2860 = (pointer)0x0;
        local_2878 = 0;
        pTStack_2870 = (pointer)0x0;
        local_2638 = false;
        local_2648 = (pointer)0x0;
        pSStack_2640 = (pointer)0x0;
        local_2658 = 0;
        pSStack_2650 = (pointer)0x0;
        bStack_2620 = false;
        uStack_261f = 0;
        pPStack_2630 = (pointer)0x0;
        uStack_2628 = 0;
        local_2627 = 0;
        local_2610[0x20] = 0;
        local_2610._33_7_ = 0;
        local_2610[0x28] = false;
        local_2610._16_8_ = 0;
        local_2610[0x18] = 0;
        local_2610._25_7_ = 0;
        local_2610._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2610._8_8_ = 0;
        local_2610[0x30] = 0;
        local_2610._52_4_ = 0.0;
        local_2610[0x38] = false;
        local_2610._60_4_ = 0;
        local_2610._64_2_ = 0;
        local_2610._72_2_ = local_2610._72_2_ & 0xff00;
        auStack_2568._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2548._0_8_ = local_2548._0_8_ & 0xffffffffffffff00;
        auStack_2438._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2428._0_8_ = 0;
        auStack_2448._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2438._0_8_ = 0;
        local_2408._0_8_ = local_2418;
        local_2418._0_4_ = 0;
        local_2410 = (undefined1  [8])0x0;
        auStack_25a0._16_8_ = auStack_25a0._16_8_ & 0xffffffffffffff00;
        auStack_25a0[0] = false;
        auStack_25a0._1_3_ = 0;
        auStack_25a0._4_4_ = (storage_t<unsigned_int>)0x0;
        auStack_25a0[8] = false;
        auStack_25a0._9_3_ = 0;
        auStack_25a0._12_4_ = (storage_t<unsigned_int>)0x0;
        auStack_25b8._8_8_ = 0;
        auStack_25b8[0x10] = false;
        auStack_25b8._17_3_ = 0;
        auStack_25b8._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_2610._80_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_25b8._0_8_ = 0;
        auStack_2568._16_8_ = auStack_2568._16_8_ & 0xffffffffffffff00;
        auStack_2568._0_8_ = 0;
        auStack_2568._8_8_ = 0;
        auStack_2580._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2580._16_8_ = 0;
        auStack_25a0._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2580._0_8_ = 0;
        auStack_2520._0_8_ = auStack_2520._0_8_ & 0xffffffffffffff00;
        auStack_2538._8_8_ = 0;
        auStack_2538._16_8_ = 0;
        local_2548._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2538._0_8_ = 0;
        auStack_2500._8_8_ = auStack_2500._8_8_ & 0xffffffffffffff00;
        auStack_2510._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2500._0_8_ = 0;
        auStack_2520._8_8_ = (storage_t<double>)0x0;
        auStack_2510._0_8_ = (storage_t<double>)0x0;
        auStack_24d0._0_8_ = auStack_24d0._0_8_ & 0xffffffffffffff00;
        auStack_24e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24e0._8_8_ = 0;
        local_24f0._0_8_ = 0;
        local_24f0._8_8_ = 0;
        auStack_24b0._24_8_ = auStack_24b0._24_8_ & 0xffffffffffffff00;
        auStack_24b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24b0._16_8_ = 0;
        auStack_24c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24b0._0_8_ = 0;
        auStack_24d0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_24c0._0_8_ = 0;
        auStack_2480._16_8_ = auStack_2480._16_8_ & 0xffffffffffffff00;
        auStack_2480._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2480._8_8_ = 0;
        local_2490._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2490._8_8_ = 0;
        auStack_2448._0_8_ = auStack_2448._0_8_ & 0xffffffffffffff00;
        auStack_2458._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2458._8_8_ = 0;
        local_2468._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2468._8_8_ = 0;
        pSStack_23d8 = (pointer)((ulong)pSStack_23d8 & 0xffffffffffffff00);
        local_2408._32_8_ = 0;
        pSStack_23e0 = (pointer)0x0;
        local_2408._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2408._24_8_ = 0;
        uStack_23c0 = 0;
        local_23bf = 0;
        bStack_23b8 = false;
        local_23d0 = (pointer)0x0;
        bStack_23c8 = false;
        uStack_23c7 = 0;
        auStack_2380[0x10] = 0;
        auStack_2380._17_7_ = 0;
        auStack_2380[0x18] = 0;
        auStack_2380._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2380[8] = 0;
        auStack_2380._9_7_ = 0;
        auStack_23a0._16_8_ = (pointer)0x0;
        auStack_23a0._24_8_ = (pointer)0x0;
        auStack_23a0._0_8_ = (pointer)0x0;
        auStack_23a0._8_8_ = (pointer)0x0;
        auStack_23b0[0] = 0;
        auStack_23b0._1_7_ = 0;
        auStack_23b0._8_8_ = (pointer)0x0;
        auStack_2380._25_8_ = auStack_2380._25_8_ & 0xffffffffffffff;
        auStack_2380._36_4_ = 0;
        auStack_2380[0x28] = false;
        auStack_2380._44_4_ = 0;
        auStack_2380._48_2_ = 0;
        local_2348 = (optional<bool>)((ushort)local_2348 & 0xff00);
        auStack_22e8._24_8_ = 0;
        auStack_22e8._32_8_ = auStack_22e8._32_8_ & 0xffffffffffffff00;
        auStack_21b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21a8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21c8._8_8_ = 0;
        auStack_21b8._0_8_ = 0;
        local_2198._16_8_ = local_2198;
        local_2198._0_4_ = 0;
        local_2198._8_8_ = 0;
        auStack_2330._32_8_ = auStack_2330._32_8_ & 0xffffffffffffff00;
        auStack_2330[0x10] = false;
        auStack_2330._17_3_ = 0;
        auStack_2330._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        auStack_2330[0x18] = false;
        auStack_2330._25_3_ = 0;
        auStack_2330._28_4_ = (storage_t<unsigned_int>)0x0;
        auStack_2330._0_8_ = (pointer)0x0;
        auStack_2330._8_8_ = (pointer)0x0;
        local_2340._0_4_ = 0.0;
        local_2340._4_4_ = 0.0;
        local_2340._8_8_ = (pointer)0x0;
        auStack_22e8._16_8_ = auStack_22e8._16_8_ & 0xffffffffffffff00;
        auStack_22e8._0_8_ = 0;
        auStack_22e8._8_8_ = 0;
        auStack_22f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_22f8._8_8_ = 0;
        local_2308[0] = false;
        local_2308._1_3_ = 0;
        local_2308._4_4_ = (storage_t<unsigned_int>)0x0;
        local_2308._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_22b0._16_8_ = auStack_22b0._16_8_ & 0xffffffffffffff00;
        auStack_22b0._0_8_ = 0;
        auStack_22b0._8_8_ = 0;
        local_22c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_22c0._8_8_ = 0;
        auStack_2278._0_8_ = auStack_2278._0_8_ & 0xffffffffffffff00;
        auStack_2288._0_8_ = 0;
        auStack_2288._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2298._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2298._8_8_ = (storage_t<double>)0x0;
        auStack_2258._8_8_ = auStack_2258._8_8_ & 0xffffffffffffff00;
        auStack_2268._8_8_ = 0;
        auStack_2258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2278._8_8_ = 0;
        auStack_2268._0_8_ = 0;
        auStack_2218._0_8_ = auStack_2218._0_8_ & 0xffffffffffffff00;
        auStack_2228._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2228._8_8_ = 0;
        auStack_2238._0_8_ = 0;
        auStack_2238._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2248._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2248._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21f8._8_8_ = auStack_21f8._8_8_ & 0xffffffffffffff00;
        auStack_2208._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21f8._0_8_ = 0;
        auStack_2218._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_2208._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_21c8._0_8_ = auStack_21c8._0_8_ & 0xffffffffffffff00;
        auStack_21d8._0_8_ = 0;
        auStack_21d8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_21e8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_21e8._8_8_ = 0;
        sStack_2168._24_8_ = local_2140;
        sStack_2168._16_8_ = sStack_2168._16_8_ & 0xffffffffffffff00;
        sStack_2168._0_8_ = 0;
        sStack_2168._8_8_ = 0;
        local_2180._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_2180._16_8_ = 0;
        local_2148._M_p = (pointer)0x0;
        local_2140 = (undefined1  [8])((ulong)local_2140 & 0xffffffffffffff00);
        local_2f70._0_8_ = pcVar1;
        local_2c38._M_right = local_2c38._M_left;
        local_2c08._M_right = local_2c08._M_left;
        local_2980._M_right = local_2980._M_left;
        local_28c8._M_right = local_28c8._M_left;
        local_2898._M_right = local_2898._M_left;
        local_2678._M_right = local_2678._M_left;
        local_2408._8_8_ = local_2408._0_8_;
        local_2180._0_8_ = local_2198._16_8_;
        ReconstructShader<tinyusdz::UsdPrimvarReader<float>>
                  ((Specifier *)ppcVar11,properties,(ReferenceList *)local_2898._M_left,
                   (UsdPrimvarReader_float *)local_2f70,warn,err,in_stack_ffffffffffffce98);
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                   ,0x5a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,"ReconstructPrim",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x12a2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_30e8,"UsdPrimvarReader_float",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          plVar8 = (long *)::std::__cxx11::string::_M_append
                                     ((char *)&local_3130,(ulong)(err->_M_dataplus)._M_p);
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_3158.field_2._M_allocated_capacity = *psVar10;
            local_3158.field_2._8_8_ = plVar8[3];
            local_3158._M_dataplus._M_p = (pointer)&local_3158.field_2;
          }
          else {
            local_3158.field_2._M_allocated_capacity = *psVar10;
            local_3158._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_3158._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
            operator_delete(local_3158._M_dataplus._M_p,local_3158.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
            operator_delete(local_3130._M_dataplus._M_p,local_3130.field_2._M_allocated_capacity + 1
                           );
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
        ::std::ios_base::~ios_base(local_3078);
        UsdPrimvarReader<float>::~UsdPrimvarReader((UsdPrimvarReader<float> *)local_2f70);
      }
LAB_002451a5:
      bVar4 = false;
      goto LAB_00247b0b;
    }
    spec_01 = (UsdUVTexture *)local_2f70;
    UsdUVTexture::UsdUVTexture((UsdUVTexture *)local_2f70);
    bVar4 = ReconstructShader<tinyusdz::UsdUVTexture>
                      ((Specifier *)spec_01,properties,references_02,(UsdUVTexture *)local_2f70,warn
                       ,err,options);
    pSVar2 = local_3138;
    if (bVar4) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_3138->info_id,0,(char *)(local_3138->info_id)._M_string_length,
                 0x3bca15);
      linb::any::operator=(&(pSVar2->value).v_,(UsdUVTexture *)local_2f70);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_30e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                 ,0x5a);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,"ReconstructPrim",0xf);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(local_30e8,0x1290);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_30e8,"Failed to Reconstruct ",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"UsdUVTexture",0xc)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_30e8,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        plVar8 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)&local_3130,(ulong)(err->_M_dataplus)._M_p);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_3158.field_2._M_allocated_capacity = *psVar10;
          local_3158.field_2._8_8_ = plVar8[3];
          local_3158._M_dataplus._M_p = (pointer)&local_3158.field_2;
        }
        else {
          local_3158.field_2._M_allocated_capacity = *psVar10;
          local_3158._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_3158._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_3158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3158._M_dataplus._M_p != &local_3158.field_2) {
          operator_delete(local_3158._M_dataplus._M_p,local_3158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3130._M_dataplus._M_p != &local_3130.field_2) {
          operator_delete(local_3130._M_dataplus._M_p,local_3130.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_30e8);
      ::std::ios_base::~ios_base(local_3078);
    }
    UsdUVTexture::~UsdUVTexture((UsdUVTexture *)local_2f70);
  }
LAB_00247afd:
  bVar4 = bVar4 != false;
LAB_00247b0b:
  if (local_3110 != &local_3100) {
    operator_delete(local_3110,CONCAT71(uStack_30ff,local_3100) + 1);
  }
  return bVar4;
}

Assistant:

bool ReconstructPrim<Shader>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Shader *shader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)properties;
  (void)options;

  bool is_generic_shader{false};
  auto info_id_prop = properties.find("info:id");
  if (info_id_prop == properties.end()) {
    // Guess MatrialX shader. info:id will be resolved by importing referenced .mtlx.
    // Treat generic Shader at the moment.
    is_generic_shader = true;
    //PUSH_ERROR_AND_RETURN("`Shader` must contain `info:id` property.");
  }

  std::string shader_type;
  if (!is_generic_shader) {
    if (info_id_prop->second.is_attribute()) {
      const Attribute &attr = info_id_prop->second.get_attribute();
      if ((attr.type_name() == value::kToken)) {
        if (auto pv = attr.get_value<value::token>()) {
          shader_type = pv.value().str();
        } else {
          PUSH_ERROR_AND_RETURN("Internal errror. `info:id` has invalid type.");
        }
      } else {
        PUSH_ERROR_AND_RETURN("`info:id` attribute must be `token` type.");
      }

      // For some corrupted? USDZ file does not have `uniform` variability.
      if (attr.variability() != Variability::Uniform) {
        PUSH_WARN("`info:id` attribute must have `uniform` variability.");
      }
    } else {
      PUSH_ERROR_AND_RETURN("Invalid type or value for `info:id` property in `Shader`.");
    }

    DCOUT("info:id = " << shader_type);
  }


  if (shader_type.compare(kUsdPreviewSurface) == 0) {
    UsdPreviewSurface surface;
    if (!ReconstructShader<UsdPreviewSurface>(spec, properties, references,
                                              &surface, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << kUsdPreviewSurface);
    }
    shader->info_id = kUsdPreviewSurface;
    shader->value = surface;
    DCOUT("info_id = " << shader->info_id);
  } else if (shader_type.compare(kUsdUVTexture) == 0) {
    UsdUVTexture texture;
    if (!ReconstructShader<UsdUVTexture>(spec, properties, references,
                                         &texture, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << kUsdUVTexture);
    }
    shader->info_id = kUsdUVTexture;
    shader->value = texture;
  } else if (shader_type.compare(kUsdPrimvarReader_int) == 0) {
    UsdPrimvarReader_int preader;
    if (!ReconstructShader<UsdPrimvarReader_int>(spec, properties, references,
                                                 &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_int);
    }
    shader->info_id = kUsdPrimvarReader_int;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float) == 0) {
    UsdPrimvarReader_float preader;
    if (!ReconstructShader<UsdPrimvarReader_float>(spec, properties, references,
                                                   &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float);
    }
    shader->info_id = kUsdPrimvarReader_float;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float2) == 0) {
    UsdPrimvarReader_float2 preader;
    if (!ReconstructShader<UsdPrimvarReader_float2>(spec, properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float2);
    }
    shader->info_id = kUsdPrimvarReader_float2;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float3) == 0) {
    UsdPrimvarReader_float3 preader;
    if (!ReconstructShader<UsdPrimvarReader_float3>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float3);
    }
    shader->info_id = kUsdPrimvarReader_float3;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float4) == 0) {
    UsdPrimvarReader_float4 preader;
    if (!ReconstructShader<UsdPrimvarReader_float4>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float4);
    }
    shader->info_id = kUsdPrimvarReader_float4;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_string) == 0) {
    UsdPrimvarReader_string preader;
    if (!ReconstructShader<UsdPrimvarReader_string>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_string);
    }
    shader->info_id = kUsdPrimvarReader_string;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_vector) == 0) {
    UsdPrimvarReader_vector preader;
    if (!ReconstructShader<UsdPrimvarReader_vector>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_vector);
    }
    shader->info_id = kUsdPrimvarReader_vector;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_normal) == 0) {
    UsdPrimvarReader_normal preader;
    if (!ReconstructShader<UsdPrimvarReader_normal>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_normal);
    }
    shader->info_id = kUsdPrimvarReader_normal;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_point) == 0) {
    UsdPrimvarReader_point preader;
    if (!ReconstructShader<UsdPrimvarReader_point>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_point);
    }
    shader->info_id = kUsdPrimvarReader_point;
    shader->value = preader;
  } else if (shader_type.compare(kUsdTransform2d) == 0) {
    UsdTransform2d transform;
    if (!ReconstructShader<UsdTransform2d>(spec,properties, references,
                                                    &transform, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdTransform2d);
    }
    shader->info_id = kUsdTransform2d;
    shader->value = transform;
  } else {
    // Reconstruct as generic ShaderNode
    ShaderNode surface;
    if (!ReconstructShader<ShaderNode>(spec,properties, references,
                                              &surface, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << shader_type);
    }
    if (shader_type.size()) {
      shader->info_id = shader_type;
    }
    shader->value = surface;
  }

  DCOUT("Shader reconstructed.");

  return true;
}